

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar67;
  byte bVar68;
  uint uVar69;
  ulong uVar70;
  long lVar71;
  undefined1 auVar72 [8];
  undefined4 uVar73;
  vint4 bi_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  vint4 bi_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  float fVar133;
  float fVar134;
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar135;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar112;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar175;
  float fVar176;
  vint4 ai_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar177;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar178;
  float fVar194;
  float fVar195;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined8 uVar196;
  float fVar214;
  vint4 ai;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar215;
  undefined1 auVar213 [32];
  float fVar219;
  float fVar241;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar258;
  float fVar267;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar279 [16];
  float fVar290;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar299;
  float fVar311;
  float fVar312;
  undefined1 auVar300 [16];
  float fVar313;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar318 [16];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4e8 [8];
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  int local_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float fStack_440;
  undefined4 uStack_43c;
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [32];
  Primitive *local_300;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  uint auStack_2b8 [4];
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_29c;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar66;
  undefined1 auVar151 [32];
  float fVar268;
  float fVar278;
  
  PVar7 = prim[1];
  uVar65 = (ulong)(byte)PVar7;
  lVar67 = uVar65 * 0x25;
  fVar178 = *(float *)(prim + lVar67 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar95._0_4_ = fVar178 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar95._4_4_ = fVar178 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar95._8_4_ = fVar178 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar95._12_4_ = fVar178 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar249._0_4_ = fVar178 * auVar21._0_4_;
  auVar249._4_4_ = fVar178 * auVar21._4_4_;
  auVar249._8_4_ = fVar178 * auVar21._8_4_;
  auVar249._12_4_ = fVar178 * auVar21._12_4_;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar317 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar317 = vcvtdq2ps_avx(auVar317);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar65 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar314._4_4_ = auVar95._0_4_;
  auVar314._0_4_ = auVar95._0_4_;
  auVar314._8_4_ = auVar95._0_4_;
  auVar314._12_4_ = auVar95._0_4_;
  auVar20 = vshufps_avx(auVar95,auVar95,0x55);
  auVar138 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar178 = auVar138._0_4_;
  auVar269._0_4_ = fVar178 * auVar317._0_4_;
  fVar194 = auVar138._4_4_;
  auVar269._4_4_ = fVar194 * auVar317._4_4_;
  fVar195 = auVar138._8_4_;
  auVar269._8_4_ = fVar195 * auVar317._8_4_;
  fVar136 = auVar138._12_4_;
  auVar269._12_4_ = fVar136 * auVar317._12_4_;
  auVar259._0_4_ = auVar183._0_4_ * fVar178;
  auVar259._4_4_ = auVar183._4_4_ * fVar194;
  auVar259._8_4_ = auVar183._8_4_ * fVar195;
  auVar259._12_4_ = auVar183._12_4_ * fVar136;
  auVar242._0_4_ = auVar19._0_4_ * fVar178;
  auVar242._4_4_ = auVar19._4_4_ * fVar194;
  auVar242._8_4_ = auVar19._8_4_ * fVar195;
  auVar242._12_4_ = auVar19._12_4_ * fVar136;
  auVar138 = vfmadd231ps_fma(auVar269,auVar20,auVar15);
  auVar124 = vfmadd231ps_fma(auVar259,auVar20,auVar17);
  auVar20 = vfmadd231ps_fma(auVar242,auVar182,auVar20);
  auVar75 = vfmadd231ps_fma(auVar138,auVar314,auVar21);
  auVar124 = vfmadd231ps_fma(auVar124,auVar314,auVar16);
  auVar76 = vfmadd231ps_fma(auVar20,auVar18,auVar314);
  auVar315._4_4_ = auVar249._0_4_;
  auVar315._0_4_ = auVar249._0_4_;
  auVar315._8_4_ = auVar249._0_4_;
  auVar315._12_4_ = auVar249._0_4_;
  auVar20 = vshufps_avx(auVar249,auVar249,0x55);
  auVar138 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar178 = auVar138._0_4_;
  auVar113._0_4_ = fVar178 * auVar317._0_4_;
  fVar194 = auVar138._4_4_;
  auVar113._4_4_ = fVar194 * auVar317._4_4_;
  fVar195 = auVar138._8_4_;
  auVar113._8_4_ = fVar195 * auVar317._8_4_;
  fVar136 = auVar138._12_4_;
  auVar113._12_4_ = fVar136 * auVar317._12_4_;
  auVar88._0_4_ = auVar183._0_4_ * fVar178;
  auVar88._4_4_ = auVar183._4_4_ * fVar194;
  auVar88._8_4_ = auVar183._8_4_ * fVar195;
  auVar88._12_4_ = auVar183._12_4_ * fVar136;
  auVar74._0_4_ = auVar19._0_4_ * fVar178;
  auVar74._4_4_ = auVar19._4_4_ * fVar194;
  auVar74._8_4_ = auVar19._8_4_ * fVar195;
  auVar74._12_4_ = auVar19._12_4_ * fVar136;
  auVar15 = vfmadd231ps_fma(auVar113,auVar20,auVar15);
  auVar317 = vfmadd231ps_fma(auVar88,auVar20,auVar17);
  auVar17 = vfmadd231ps_fma(auVar74,auVar20,auVar182);
  auVar88 = vfmadd231ps_fma(auVar15,auVar315,auVar21);
  auVar89 = vfmadd231ps_fma(auVar317,auVar315,auVar16);
  local_338._8_4_ = 0x7fffffff;
  local_338._0_8_ = 0x7fffffff7fffffff;
  local_338._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar75,local_338);
  auVar220._8_4_ = 0x219392ef;
  auVar220._0_8_ = 0x219392ef219392ef;
  auVar220._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar220,1);
  auVar15 = vblendvps_avx(auVar75,auVar220,auVar21);
  auVar21 = vandps_avx(auVar124,local_338);
  auVar21 = vcmpps_avx(auVar21,auVar220,1);
  auVar317 = vblendvps_avx(auVar124,auVar220,auVar21);
  auVar21 = vandps_avx(auVar76,local_338);
  auVar21 = vcmpps_avx(auVar21,auVar220,1);
  auVar21 = vblendvps_avx(auVar76,auVar220,auVar21);
  auVar166 = vfmadd231ps_fma(auVar17,auVar315,auVar18);
  auVar16 = vrcpps_avx(auVar15);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = &DAT_3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar221);
  auVar75 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  auVar15 = vrcpps_avx(auVar317);
  auVar317 = vfnmadd213ps_fma(auVar317,auVar15,auVar221);
  auVar76 = vfmadd132ps_fma(auVar317,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar21);
  auVar21 = vfnmadd213ps_fma(auVar21,auVar15,auVar221);
  auVar249 = vfmadd132ps_fma(auVar21,auVar15,auVar15);
  fVar178 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar197._4_4_ = fVar178;
  auVar197._0_4_ = fVar178;
  auVar197._8_4_ = fVar178;
  auVar197._12_4_ = fVar178;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar74 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar317._8_8_ = 0;
  auVar317._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar317);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar317 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar21 = vpmovsxwd_avx(auVar17);
  uVar70 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar65 * 2 + uVar70 + 6);
  auVar15 = vpmovsxwd_avx(auVar183);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar16 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar182);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar17 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar183 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar65) + 6);
  auVar21 = vpmovsxwd_avx(auVar138);
  auVar21 = vcvtdq2ps_avx(auVar21);
  local_300 = prim;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar124);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar15 = vfmadd213ps_fma(auVar15,auVar197,auVar21);
  auVar21 = vsubps_avx(auVar74,auVar88);
  auVar198._0_4_ = auVar75._0_4_ * auVar21._0_4_;
  auVar198._4_4_ = auVar75._4_4_ * auVar21._4_4_;
  auVar198._8_4_ = auVar75._8_4_ * auVar21._8_4_;
  auVar198._12_4_ = auVar75._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar317,auVar88);
  auVar114._0_4_ = auVar75._0_4_ * auVar21._0_4_;
  auVar114._4_4_ = auVar75._4_4_ * auVar21._4_4_;
  auVar114._8_4_ = auVar75._8_4_ * auVar21._8_4_;
  auVar114._12_4_ = auVar75._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar16,auVar89);
  auVar179._0_4_ = auVar76._0_4_ * auVar21._0_4_;
  auVar179._4_4_ = auVar76._4_4_ * auVar21._4_4_;
  auVar179._8_4_ = auVar76._8_4_ * auVar21._8_4_;
  auVar179._12_4_ = auVar76._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar17,auVar89);
  auVar89._0_4_ = auVar76._0_4_ * auVar21._0_4_;
  auVar89._4_4_ = auVar76._4_4_ * auVar21._4_4_;
  auVar89._8_4_ = auVar76._8_4_ * auVar21._8_4_;
  auVar89._12_4_ = auVar76._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar183,auVar166);
  auVar155._0_4_ = auVar249._0_4_ * auVar21._0_4_;
  auVar155._4_4_ = auVar249._4_4_ * auVar21._4_4_;
  auVar155._8_4_ = auVar249._8_4_ * auVar21._8_4_;
  auVar155._12_4_ = auVar249._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar15,auVar166);
  auVar75._0_4_ = auVar249._0_4_ * auVar21._0_4_;
  auVar75._4_4_ = auVar249._4_4_ * auVar21._4_4_;
  auVar75._8_4_ = auVar249._8_4_ * auVar21._8_4_;
  auVar75._12_4_ = auVar249._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar198,auVar114);
  auVar15 = vpminsd_avx(auVar179,auVar89);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vpminsd_avx(auVar155,auVar75);
  uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar243._4_4_ = uVar73;
  auVar243._0_4_ = uVar73;
  auVar243._8_4_ = uVar73;
  auVar243._12_4_ = uVar73;
  auVar15 = vmaxps_avx(auVar15,auVar243);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  local_278._0_4_ = auVar21._0_4_ * 0.99999964;
  local_278._4_4_ = auVar21._4_4_ * 0.99999964;
  local_278._8_4_ = auVar21._8_4_ * 0.99999964;
  local_278._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar198,auVar114);
  auVar15 = vpmaxsd_avx(auVar179,auVar89);
  auVar21 = vminps_avx(auVar21,auVar15);
  auVar15 = vpmaxsd_avx(auVar155,auVar75);
  fVar178 = (ray->super_RayK<1>).tfar;
  auVar115._4_4_ = fVar178;
  auVar115._0_4_ = fVar178;
  auVar115._8_4_ = fVar178;
  auVar115._12_4_ = fVar178;
  auVar15 = vminps_avx(auVar15,auVar115);
  auVar21 = vminps_avx(auVar21,auVar15);
  auVar76._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar76._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar76._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar76._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar166._1_3_ = 0;
  auVar166[0] = PVar7;
  auVar166[4] = PVar7;
  auVar166._5_3_ = 0;
  auVar166[8] = PVar7;
  auVar166._9_3_ = 0;
  auVar166[0xc] = PVar7;
  auVar166._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar166,_DAT_01ff0cf0);
  auVar21 = vcmpps_avx(local_278,auVar76,2);
  auVar21 = vandps_avx(auVar21,auVar15);
  uVar61 = vmovmskps_avx(auVar21);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_1f8 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  local_368 = 0x80000000;
  uStack_364 = 0x80000000;
  uStack_360 = 0x80000000;
  uStack_35c = 0x80000000;
LAB_01787e5c:
  lVar67 = 0;
  for (uVar65 = (ulong)uVar61; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar64 = *(uint *)(local_300 + 2);
  pGVar8 = (context->scene->geometries).items[uVar64].ptr;
  fVar178 = (pGVar8->time_range).lower;
  fVar195 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar178) /
            ((pGVar8->time_range).upper - fVar178));
  auVar21 = vroundss_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),9);
  auVar21 = vminss_avx(auVar21,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar20 = vmaxss_avx(ZEXT816(0),auVar21);
  local_430 = (ulong)*(uint *)(local_300 + lVar67 * 4 + 6);
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_300 + lVar67 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar20._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar71);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar71);
  auVar21 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar65);
  lVar67 = uVar65 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar67);
  lVar1 = uVar65 + 2;
  auVar317 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar65 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar197 = *pauVar3;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar71);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar71);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar65);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar67);
  auVar183 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar178 = *pfVar4;
  fVar194 = pfVar4[1];
  fVar136 = pfVar4[2];
  fVar112 = pfVar4[3];
  auVar279._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar279._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar279._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar279._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar137._8_4_ = 0x3e2aaaab;
  auVar137._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar137._12_4_ = 0x3e2aaaab;
  auVar75 = vfmadd213ps_fma(auVar137,auVar317,auVar279);
  auVar323._8_4_ = 0x3f000000;
  auVar323._0_8_ = 0x3f0000003f000000;
  auVar323._12_4_ = 0x3f000000;
  auVar18 = vfmadd231ps_fma(auVar279,auVar317,auVar323);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar15,ZEXT816(0) << 0x40);
  auVar114 = vfnmadd231ps_fma(auVar18,auVar21,auVar323);
  auVar180._0_4_ = fVar178 * 0.0;
  auVar180._4_4_ = fVar194 * 0.0;
  auVar180._8_4_ = fVar136 * 0.0;
  auVar180._12_4_ = fVar112 * 0.0;
  auVar18 = vfmadd213ps_fma(auVar137,auVar183,auVar180);
  auVar156._8_4_ = 0x3f2aaaab;
  auVar156._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar156._12_4_ = 0x3f2aaaab;
  auVar18 = vfmadd231ps_fma(auVar18,auVar17,auVar156);
  auVar18 = vfmadd231ps_fma(auVar18,auVar16,auVar137);
  auVar182 = vfmadd231ps_fma(auVar180,auVar183,auVar323);
  auVar138 = ZEXT816(0);
  auVar182 = vfnmadd231ps_fma(auVar182,auVar17,auVar138);
  auVar19 = vfnmadd231ps_fma(auVar182,auVar16,auVar323);
  auVar300._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar300._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar300._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar300._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar182 = vfmadd231ps_fma(auVar300,auVar138,auVar317);
  auVar182 = vfnmadd231ps_fma(auVar182,auVar323,auVar15);
  auVar115 = vfnmadd231ps_fma(auVar182,auVar138,auVar21);
  auVar244._0_4_ = fVar178 * 0.16666667;
  auVar244._4_4_ = fVar194 * 0.16666667;
  auVar244._8_4_ = fVar136 * 0.16666667;
  auVar244._12_4_ = fVar112 * 0.16666667;
  auVar182 = vfmadd231ps_fma(auVar244,auVar183,auVar156);
  auVar182 = vfmadd231ps_fma(auVar182,auVar17,auVar137);
  auVar182 = vfmadd231ps_fma(auVar182,auVar16,auVar138);
  auVar199._0_4_ = fVar178 * 0.5;
  auVar199._4_4_ = fVar194 * 0.5;
  auVar199._8_4_ = fVar136 * 0.5;
  auVar199._12_4_ = fVar112 * 0.5;
  auVar183 = vfmadd231ps_fma(auVar199,auVar138,auVar183);
  auVar17 = vfnmadd231ps_fma(auVar183,auVar323,auVar17);
  auVar183 = vfnmadd231ps_fma(auVar17,auVar138,auVar16);
  auVar16 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar17 = vshufps_avx(auVar18,auVar18,0xc9);
  fVar267 = auVar114._0_4_;
  auVar90._0_4_ = fVar267 * auVar17._0_4_;
  fVar268 = auVar114._4_4_;
  auVar90._4_4_ = fVar268 * auVar17._4_4_;
  fVar278 = auVar114._8_4_;
  auVar90._8_4_ = fVar278 * auVar17._8_4_;
  fVar290 = auVar114._12_4_;
  auVar90._12_4_ = fVar290 * auVar17._12_4_;
  auVar249 = vfmsub231ps_fma(auVar90,auVar16,auVar18);
  auVar17 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar91._0_4_ = fVar267 * auVar17._0_4_;
  auVar91._4_4_ = fVar268 * auVar17._4_4_;
  auVar91._8_4_ = fVar278 * auVar17._8_4_;
  auVar91._12_4_ = fVar290 * auVar17._12_4_;
  auVar74 = vfmsub231ps_fma(auVar91,auVar16,auVar19);
  auVar16 = vshufps_avx(auVar115,auVar115,0xc9);
  auVar17 = vshufps_avx(auVar182,auVar182,0xc9);
  fVar299 = auVar115._0_4_;
  auVar92._0_4_ = fVar299 * auVar17._0_4_;
  fVar311 = auVar115._4_4_;
  auVar92._4_4_ = fVar311 * auVar17._4_4_;
  fVar312 = auVar115._8_4_;
  auVar92._8_4_ = fVar312 * auVar17._8_4_;
  fVar313 = auVar115._12_4_;
  auVar92._12_4_ = fVar313 * auVar17._12_4_;
  auVar88 = vfmsub231ps_fma(auVar92,auVar16,auVar182);
  auVar17 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar93._0_4_ = fVar299 * auVar17._0_4_;
  auVar93._4_4_ = fVar311 * auVar17._4_4_;
  auVar93._8_4_ = fVar312 * auVar17._8_4_;
  auVar93._12_4_ = fVar313 * auVar17._12_4_;
  auVar89 = vfmsub231ps_fma(auVar93,auVar16,auVar183);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar71);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar71);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar113 = *pauVar3;
  lVar13 = *(long *)(lVar10 + 0x38 + lVar71);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar71);
  auVar260._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar260._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar260._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar260._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar76 = vfmadd213ps_fma(auVar137,auVar16,auVar260);
  auVar183 = vfmadd231ps_fma(auVar260,auVar16,auVar323);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar67);
  auVar18 = vfnmadd231ps_fma(auVar183,auVar17,ZEXT816(0) << 0x20);
  auVar183 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar65);
  auVar155 = vfnmadd231ps_fma(auVar18,auVar183,auVar323);
  auVar18 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar178 = *pfVar4;
  fVar194 = pfVar4[1];
  fVar136 = pfVar4[2];
  fVar112 = pfVar4[3];
  auVar77._0_4_ = fVar178 * 0.0;
  auVar77._4_4_ = fVar194 * 0.0;
  auVar77._8_4_ = fVar136 * 0.0;
  auVar77._12_4_ = fVar112 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar137,auVar18,auVar77);
  auVar182 = *(undefined1 (*) [16])(lVar13 + lVar67 * lVar10);
  auVar94._8_4_ = 0x3f2aaaab;
  auVar94._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar94._12_4_ = 0x3f2aaaab;
  auVar138 = vfmadd231ps_fma(auVar19,auVar182,auVar94);
  auVar19 = *(undefined1 (*) [16])(lVar13 + uVar65 * lVar10);
  auVar124 = vfmadd231ps_fma(auVar138,auVar19,auVar137);
  auVar138 = vshufps_avx(auVar124,auVar124,0xc9);
  fVar218 = auVar155._0_4_;
  auVar222._0_4_ = fVar218 * auVar138._0_4_;
  fVar219 = auVar155._4_4_;
  auVar222._4_4_ = fVar219 * auVar138._4_4_;
  fVar241 = auVar155._8_4_;
  auVar222._8_4_ = fVar241 * auVar138._8_4_;
  fVar258 = auVar155._12_4_;
  auVar222._12_4_ = fVar258 * auVar138._12_4_;
  auVar138 = vshufps_avx(auVar155,auVar155,0xc9);
  auVar166 = vfmsub231ps_fma(auVar222,auVar138,auVar124);
  auVar124 = vfmadd231ps_fma(auVar77,auVar18,auVar323);
  auVar124 = vfnmadd231ps_fma(auVar124,auVar182,ZEXT816(0) << 0x20);
  auVar95 = vfnmadd231ps_fma(auVar124,auVar19,auVar323);
  auVar124 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar181._0_4_ = fVar218 * auVar124._0_4_;
  auVar181._4_4_ = fVar219 * auVar124._4_4_;
  auVar181._8_4_ = fVar241 * auVar124._8_4_;
  auVar181._12_4_ = fVar258 * auVar124._12_4_;
  auVar124 = vfmsub231ps_fma(auVar181,auVar138,auVar95);
  auVar78._0_4_ = fVar178 * 0.16666667;
  auVar78._4_4_ = fVar194 * 0.16666667;
  auVar78._8_4_ = fVar136 * 0.16666667;
  auVar78._12_4_ = fVar112 * 0.16666667;
  auVar223._8_4_ = 0x3f2aaaab;
  auVar223._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar223._12_4_ = 0x3f2aaaab;
  auVar138 = vfmadd231ps_fma(auVar78,auVar18,auVar223);
  auVar139._0_4_ = fVar178 * 0.5;
  auVar139._4_4_ = fVar194 * 0.5;
  auVar139._8_4_ = fVar136 * 0.5;
  auVar139._12_4_ = fVar112 * 0.5;
  auVar95 = ZEXT816(0) << 0x20;
  auVar18 = vfmadd231ps_fma(auVar139,auVar95,auVar18);
  auVar138 = vfmadd231ps_fma(auVar138,auVar182,auVar137);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar323,auVar182);
  auVar182 = vfmadd231ps_fma(auVar138,auVar19,auVar95);
  auVar19 = vfnmadd231ps_fma(auVar18,auVar95,auVar19);
  local_508 = auVar113._0_4_;
  fStack_504 = auVar113._4_4_;
  fStack_500 = auVar113._8_4_;
  fStack_4fc = auVar113._12_4_;
  auVar245._0_4_ = local_508 * 0.5;
  auVar245._4_4_ = fStack_504 * 0.5;
  auVar245._8_4_ = fStack_500 * 0.5;
  auVar245._12_4_ = fStack_4fc * 0.5;
  auVar18 = vfmadd231ps_fma(auVar245,auVar95,auVar16);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar323,auVar17);
  auVar179 = vfnmadd231ps_fma(auVar18,auVar95,auVar183);
  auVar18 = vshufps_avx(auVar182,auVar182,0xc9);
  fVar214 = auVar179._0_4_;
  auVar96._0_4_ = fVar214 * auVar18._0_4_;
  fVar215 = auVar179._4_4_;
  auVar96._4_4_ = fVar215 * auVar18._4_4_;
  fVar216 = auVar179._8_4_;
  auVar96._8_4_ = fVar216 * auVar18._8_4_;
  fVar217 = auVar179._12_4_;
  auVar96._12_4_ = fVar217 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar95 = vfmsub231ps_fma(auVar96,auVar18,auVar182);
  auVar182 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar79._0_4_ = fVar214 * auVar182._0_4_;
  auVar79._4_4_ = fVar215 * auVar182._4_4_;
  auVar79._8_4_ = fVar216 * auVar182._8_4_;
  auVar79._12_4_ = fVar217 * auVar182._12_4_;
  auVar113 = vfmsub231ps_fma(auVar79,auVar18,auVar19);
  fVar195 = fVar195 - auVar20._0_4_;
  local_4e8._0_4_ = auVar197._0_4_;
  local_4e8._4_4_ = auVar197._4_4_;
  uStack_4e0._0_4_ = auVar197._8_4_;
  uStack_4e0._4_4_ = auVar197._12_4_;
  auVar97._0_4_ = (float)local_4e8._0_4_ * 0.16666667;
  auVar97._4_4_ = (float)local_4e8._4_4_ * 0.16666667;
  auVar97._8_4_ = (float)uStack_4e0 * 0.16666667;
  auVar97._12_4_ = uStack_4e0._4_4_ * 0.16666667;
  auVar317 = vfmadd231ps_fma(auVar97,auVar223,auVar317);
  auVar18 = vfmadd231ps_fma(auVar75,auVar15,auVar223);
  auVar182 = vfmadd231ps_fma(auVar317,auVar15,auVar137);
  auVar317 = vpermilps_avx(auVar249,0xc9);
  auVar15 = vdpps_avx(auVar317,auVar317,0x7f);
  auVar19 = vfmadd231ps_fma(auVar18,auVar21,auVar137);
  auVar20 = vfmadd231ps_fma(auVar182,auVar21,ZEXT816(0));
  auVar18 = vpermilps_avx(auVar74,0xc9);
  fVar194 = auVar15._0_4_;
  auVar182 = ZEXT416((uint)fVar194);
  auVar21 = vrsqrtss_avx(auVar182,auVar182);
  fVar178 = auVar21._0_4_;
  auVar21 = vdpps_avx(auVar317,auVar18,0x7f);
  fVar178 = fVar178 * 1.5 + fVar194 * -0.5 * fVar178 * fVar178 * fVar178;
  auVar157._0_4_ = fVar194 * auVar18._0_4_;
  auVar157._4_4_ = fVar194 * auVar18._4_4_;
  auVar157._8_4_ = fVar194 * auVar18._8_4_;
  auVar157._12_4_ = fVar194 * auVar18._12_4_;
  fVar194 = auVar21._0_4_;
  auVar200._0_4_ = fVar194 * auVar317._0_4_;
  auVar200._4_4_ = fVar194 * auVar317._4_4_;
  auVar200._8_4_ = fVar194 * auVar317._8_4_;
  auVar200._12_4_ = fVar194 * auVar317._12_4_;
  auVar18 = vsubps_avx(auVar157,auVar200);
  auVar21 = vrcpss_avx(auVar182,auVar182);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar21,SUB6416(ZEXT464(0x40000000),0));
  fVar136 = auVar21._0_4_ * auVar15._0_4_;
  auVar182 = vpermilps_avx(auVar88,0xc9);
  fVar111 = auVar317._0_4_ * fVar178;
  fVar133 = auVar317._4_4_ * fVar178;
  fVar134 = auVar317._8_4_ * fVar178;
  fVar135 = auVar317._12_4_ * fVar178;
  auVar15 = vdpps_avx(auVar182,auVar182,0x7f);
  auVar21 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar317 = vrsqrtss_avx(auVar21,auVar21);
  fVar112 = auVar15._0_4_;
  fVar194 = auVar317._0_4_;
  fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar112 * -0.5 * fVar194;
  auVar317 = vpermilps_avx(auVar89,0xc9);
  auVar324._0_4_ = fVar112 * auVar317._0_4_;
  auVar324._4_4_ = fVar112 * auVar317._4_4_;
  auVar324._8_4_ = fVar112 * auVar317._8_4_;
  auVar324._12_4_ = fVar112 * auVar317._12_4_;
  auVar317 = vdpps_avx(auVar182,auVar317,0x7f);
  fVar112 = auVar317._0_4_;
  auVar224._0_4_ = fVar112 * auVar182._0_4_;
  auVar224._4_4_ = fVar112 * auVar182._4_4_;
  auVar224._8_4_ = fVar112 * auVar182._8_4_;
  auVar224._12_4_ = fVar112 * auVar182._12_4_;
  auVar317 = vsubps_avx(auVar324,auVar224);
  auVar21 = vrcpss_avx(auVar21,auVar21);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar21,ZEXT416(0x40000000));
  fVar112 = auVar21._0_4_ * auVar15._0_4_;
  fVar154 = auVar182._0_4_ * fVar194;
  fVar175 = auVar182._4_4_ * fVar194;
  fVar176 = auVar182._8_4_ * fVar194;
  fVar177 = auVar182._12_4_ * fVar194;
  auVar21 = vshufps_avx(auVar114,auVar114,0xff);
  auVar15 = vshufps_avx(auVar19,auVar19,0xff);
  auVar225._0_4_ = auVar15._0_4_ * fVar111;
  auVar225._4_4_ = auVar15._4_4_ * fVar133;
  auVar225._8_4_ = auVar15._8_4_ * fVar134;
  auVar225._12_4_ = auVar15._12_4_ * fVar135;
  auVar80._0_4_ = auVar21._0_4_ * fVar111 + auVar15._0_4_ * fVar178 * fVar136 * auVar18._0_4_;
  auVar80._4_4_ = auVar21._4_4_ * fVar133 + auVar15._4_4_ * fVar178 * fVar136 * auVar18._4_4_;
  auVar80._8_4_ = auVar21._8_4_ * fVar134 + auVar15._8_4_ * fVar178 * fVar136 * auVar18._8_4_;
  auVar80._12_4_ = auVar21._12_4_ * fVar135 + auVar15._12_4_ * fVar178 * fVar136 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar19,auVar225);
  local_528._0_4_ = auVar19._0_4_ + auVar225._0_4_;
  local_528._4_4_ = auVar19._4_4_ + auVar225._4_4_;
  fStack_520 = auVar19._8_4_ + auVar225._8_4_;
  fStack_51c = auVar19._12_4_ + auVar225._12_4_;
  auVar182 = vsubps_avx(auVar114,auVar80);
  auVar21 = vshufps_avx(auVar115,auVar115,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar158._0_4_ = auVar15._0_4_ * fVar154;
  auVar158._4_4_ = auVar15._4_4_ * fVar175;
  auVar158._8_4_ = auVar15._8_4_ * fVar176;
  auVar158._12_4_ = auVar15._12_4_ * fVar177;
  auVar140._0_4_ = auVar21._0_4_ * fVar154 + auVar15._0_4_ * fVar194 * auVar317._0_4_ * fVar112;
  auVar140._4_4_ = auVar21._4_4_ * fVar175 + auVar15._4_4_ * fVar194 * auVar317._4_4_ * fVar112;
  auVar140._8_4_ = auVar21._8_4_ * fVar176 + auVar15._8_4_ * fVar194 * auVar317._8_4_ * fVar112;
  auVar140._12_4_ = auVar21._12_4_ * fVar177 + auVar15._12_4_ * fVar194 * auVar317._12_4_ * fVar112;
  auVar317 = vsubps_avx(auVar20,auVar158);
  local_4e8._4_4_ = auVar20._4_4_ + auVar158._4_4_;
  local_4e8._0_4_ = auVar20._0_4_ + auVar158._0_4_;
  uStack_4e0._0_4_ = auVar20._8_4_ + auVar158._8_4_;
  uStack_4e0._4_4_ = auVar20._12_4_ + auVar158._12_4_;
  auVar19 = vsubps_avx(auVar115,auVar140);
  auVar81._8_4_ = 0x3e2aaaab;
  auVar81._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar81._12_4_ = 0x3e2aaaab;
  auVar301._0_4_ = local_508 * 0.16666667;
  auVar301._4_4_ = fStack_504 * 0.16666667;
  auVar301._8_4_ = fStack_500 * 0.16666667;
  auVar301._12_4_ = fStack_4fc * 0.16666667;
  auVar116._8_4_ = 0x3f2aaaab;
  auVar116._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar116._12_4_ = 0x3f2aaaab;
  auVar21 = vfmadd231ps_fma(auVar301,auVar116,auVar16);
  auVar15 = vfmadd231ps_fma(auVar76,auVar17,auVar116);
  auVar16 = vfmadd231ps_fma(auVar21,auVar17,auVar81);
  auVar17 = vpermilps_avx(auVar166,0xc9);
  auVar21 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar20 = vfmadd231ps_fma(auVar15,auVar183,auVar81);
  auVar54._12_4_ = 0;
  auVar54._0_12_ = ZEXT812(0);
  auVar138 = vfmadd231ps_fma(auVar16,auVar183,auVar54 << 0x20);
  auVar16 = vpermilps_avx(auVar124,0xc9);
  fVar194 = auVar21._0_4_;
  auVar183 = ZEXT416((uint)fVar194);
  auVar15 = vrsqrtss_avx(auVar183,auVar183);
  fVar178 = auVar15._0_4_;
  auVar15 = vdpps_avx(auVar17,auVar16,0x7f);
  fVar178 = fVar178 * 1.5 + fVar178 * fVar178 * fVar194 * -0.5 * fVar178;
  auVar159._0_4_ = fVar194 * auVar16._0_4_;
  auVar159._4_4_ = fVar194 * auVar16._4_4_;
  auVar159._8_4_ = fVar194 * auVar16._8_4_;
  auVar159._12_4_ = fVar194 * auVar16._12_4_;
  fVar194 = auVar15._0_4_;
  auVar226._0_4_ = fVar194 * auVar17._0_4_;
  auVar226._4_4_ = fVar194 * auVar17._4_4_;
  auVar226._8_4_ = fVar194 * auVar17._8_4_;
  auVar226._12_4_ = fVar194 * auVar17._12_4_;
  auVar16 = vsubps_avx(auVar159,auVar226);
  auVar15 = vrcpss_avx(auVar183,auVar183);
  auVar21 = vfnmadd213ss_fma(auVar21,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar136 = auVar15._0_4_ * auVar21._0_4_;
  auVar183 = vpermilps_avx(auVar95,0xc9);
  fVar111 = auVar17._0_4_ * fVar178;
  fVar133 = auVar17._4_4_ * fVar178;
  fVar134 = auVar17._8_4_ * fVar178;
  fVar135 = auVar17._12_4_ * fVar178;
  auVar21 = vdpps_avx(auVar183,auVar183,0x7f);
  fVar112 = auVar21._0_4_;
  auVar124 = ZEXT416((uint)fVar112);
  auVar15 = vrsqrtss_avx(auVar124,auVar124);
  fVar194 = auVar15._0_4_;
  fVar194 = fVar112 * -0.5 * fVar194 * fVar194 * fVar194 + fVar194 * 1.5;
  auVar15 = vpermilps_avx(auVar113,0xc9);
  auVar316._0_4_ = fVar112 * auVar15._0_4_;
  auVar316._4_4_ = fVar112 * auVar15._4_4_;
  auVar316._8_4_ = fVar112 * auVar15._8_4_;
  auVar316._12_4_ = fVar112 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar183,auVar15,0x7f);
  fVar112 = auVar15._0_4_;
  auVar280._0_4_ = fVar112 * auVar183._0_4_;
  auVar280._4_4_ = fVar112 * auVar183._4_4_;
  auVar280._8_4_ = fVar112 * auVar183._8_4_;
  auVar280._12_4_ = fVar112 * auVar183._12_4_;
  auVar17 = vsubps_avx(auVar316,auVar280);
  auVar15 = vrcpss_avx(auVar124,auVar124);
  auVar21 = vfnmadd213ss_fma(auVar21,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar112 = auVar15._0_4_ * auVar21._0_4_;
  fVar154 = auVar183._0_4_ * fVar194;
  fVar175 = auVar183._4_4_ * fVar194;
  fVar176 = auVar183._8_4_ * fVar194;
  fVar177 = auVar183._12_4_ * fVar194;
  auVar21 = vshufps_avx(auVar155,auVar155,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar141._0_4_ = auVar15._0_4_ * fVar111;
  auVar141._4_4_ = auVar15._4_4_ * fVar133;
  auVar141._8_4_ = auVar15._8_4_ * fVar134;
  auVar141._12_4_ = auVar15._12_4_ * fVar135;
  auVar98._0_4_ = auVar21._0_4_ * fVar111 + auVar15._0_4_ * fVar178 * fVar136 * auVar16._0_4_;
  auVar98._4_4_ = auVar21._4_4_ * fVar133 + auVar15._4_4_ * fVar178 * fVar136 * auVar16._4_4_;
  auVar98._8_4_ = auVar21._8_4_ * fVar134 + auVar15._8_4_ * fVar178 * fVar136 * auVar16._8_4_;
  auVar98._12_4_ = auVar21._12_4_ * fVar135 + auVar15._12_4_ * fVar178 * fVar136 * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar20,auVar141);
  fVar136 = auVar20._0_4_ + auVar141._0_4_;
  fVar111 = auVar20._4_4_ + auVar141._4_4_;
  fVar133 = auVar20._8_4_ + auVar141._8_4_;
  fVar134 = auVar20._12_4_ + auVar141._12_4_;
  auVar183 = vsubps_avx(auVar155,auVar98);
  auVar21 = vshufps_avx(auVar179,auVar179,0xff);
  auVar15 = vshufps_avx(auVar138,auVar138,0xff);
  auVar160._0_4_ = auVar15._0_4_ * fVar154;
  auVar160._4_4_ = auVar15._4_4_ * fVar175;
  auVar160._8_4_ = auVar15._8_4_ * fVar176;
  auVar160._12_4_ = auVar15._12_4_ * fVar177;
  auVar99._0_4_ = auVar21._0_4_ * fVar154 + auVar15._0_4_ * fVar194 * auVar17._0_4_ * fVar112;
  auVar99._4_4_ = auVar21._4_4_ * fVar175 + auVar15._4_4_ * fVar194 * auVar17._4_4_ * fVar112;
  auVar99._8_4_ = auVar21._8_4_ * fVar176 + auVar15._8_4_ * fVar194 * auVar17._8_4_ * fVar112;
  auVar99._12_4_ = auVar21._12_4_ * fVar177 + auVar15._12_4_ * fVar194 * auVar17._12_4_ * fVar112;
  auVar21 = vsubps_avx(auVar138,auVar160);
  auVar161._0_4_ = auVar138._0_4_ + auVar160._0_4_;
  auVar161._4_4_ = auVar138._4_4_ + auVar160._4_4_;
  auVar161._8_4_ = auVar138._8_4_ + auVar160._8_4_;
  auVar161._12_4_ = auVar138._12_4_ + auVar160._12_4_;
  auVar15 = vsubps_avx(auVar179,auVar99);
  local_538 = auVar182._0_4_;
  fStack_534 = auVar182._4_4_;
  fStack_530 = auVar182._8_4_;
  fStack_52c = auVar182._12_4_;
  auVar302._0_4_ = auVar18._0_4_ + local_538 * 0.33333334;
  auVar302._4_4_ = auVar18._4_4_ + fStack_534 * 0.33333334;
  auVar302._8_4_ = auVar18._8_4_ + fStack_530 * 0.33333334;
  auVar302._12_4_ = auVar18._12_4_ + fStack_52c * 0.33333334;
  fVar178 = 1.0 - fVar195;
  auVar100._4_4_ = fVar178;
  auVar100._0_4_ = fVar178;
  auVar100._8_4_ = fVar178;
  auVar100._12_4_ = fVar178;
  auVar227._0_4_ = fVar195 * auVar16._0_4_;
  auVar227._4_4_ = fVar195 * auVar16._4_4_;
  auVar227._8_4_ = fVar195 * auVar16._8_4_;
  auVar227._12_4_ = fVar195 * auVar16._12_4_;
  local_378 = vfmadd231ps_fma(auVar227,auVar100,auVar18);
  auVar117._0_4_ = fVar195 * (auVar16._0_4_ + auVar183._0_4_ * 0.33333334);
  auVar117._4_4_ = fVar195 * (auVar16._4_4_ + auVar183._4_4_ * 0.33333334);
  auVar117._8_4_ = fVar195 * (auVar16._8_4_ + auVar183._8_4_ * 0.33333334);
  auVar117._12_4_ = fVar195 * (auVar16._12_4_ + auVar183._12_4_ * 0.33333334);
  local_388 = vfmadd231ps_fma(auVar117,auVar100,auVar302);
  local_478._0_4_ = auVar19._0_4_;
  local_478._4_4_ = auVar19._4_4_;
  fStack_470 = auVar19._8_4_;
  fStack_46c = auVar19._12_4_;
  auVar118._0_4_ = (float)local_478._0_4_ * 0.33333334;
  auVar118._4_4_ = (float)local_478._4_4_ * 0.33333334;
  auVar118._8_4_ = fStack_470 * 0.33333334;
  auVar118._12_4_ = fStack_46c * 0.33333334;
  auVar16 = vsubps_avx(auVar317,auVar118);
  auVar270._0_4_ = (fVar299 + auVar140._0_4_) * 0.33333334;
  auVar270._4_4_ = (fVar311 + auVar140._4_4_) * 0.33333334;
  auVar270._8_4_ = (fVar312 + auVar140._8_4_) * 0.33333334;
  auVar270._12_4_ = (fVar313 + auVar140._12_4_) * 0.33333334;
  auVar17 = vsubps_avx(_local_4e8,auVar270);
  auVar281._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar281._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar281._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar281._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar21,auVar281);
  auVar246._0_4_ = (fVar214 + auVar99._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar215 + auVar99._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar216 + auVar99._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar217 + auVar99._12_4_) * 0.33333334;
  auVar183 = vsubps_avx(auVar161,auVar246);
  auVar282._0_4_ = fVar195 * auVar15._0_4_;
  auVar282._4_4_ = fVar195 * auVar15._4_4_;
  auVar282._8_4_ = fVar195 * auVar15._8_4_;
  auVar282._12_4_ = fVar195 * auVar15._12_4_;
  auVar201._0_4_ = fVar195 * auVar21._0_4_;
  auVar201._4_4_ = fVar195 * auVar21._4_4_;
  auVar201._8_4_ = fVar195 * auVar21._8_4_;
  auVar201._12_4_ = fVar195 * auVar21._12_4_;
  local_398 = vfmadd231ps_fma(auVar282,auVar100,auVar16);
  local_3a8 = vfmadd231ps_fma(auVar201,auVar100,auVar317);
  auVar119._0_4_ = fVar195 * fVar136;
  auVar119._4_4_ = fVar195 * fVar111;
  auVar119._8_4_ = fVar195 * fVar133;
  auVar119._12_4_ = fVar195 * fVar134;
  auVar142._0_4_ = fVar195 * (fVar136 + (fVar218 + auVar98._0_4_) * 0.33333334);
  auVar142._4_4_ = fVar195 * (fVar111 + (fVar219 + auVar98._4_4_) * 0.33333334);
  auVar142._8_4_ = fVar195 * (fVar133 + (fVar241 + auVar98._8_4_) * 0.33333334);
  auVar142._12_4_ = fVar195 * (fVar134 + (fVar258 + auVar98._12_4_) * 0.33333334);
  auVar184._0_4_ = fVar195 * auVar183._0_4_;
  auVar184._4_4_ = fVar195 * auVar183._4_4_;
  auVar184._8_4_ = fVar195 * auVar183._8_4_;
  auVar184._12_4_ = fVar195 * auVar183._12_4_;
  auVar162._0_4_ = fVar195 * auVar161._0_4_;
  auVar162._4_4_ = fVar195 * auVar161._4_4_;
  auVar162._8_4_ = fVar195 * auVar161._8_4_;
  auVar162._12_4_ = fVar195 * auVar161._12_4_;
  _local_3b8 = vfmadd231ps_fma(auVar119,auVar100,_local_528);
  auVar55._4_4_ = (float)local_528._4_4_ + (fVar268 + auVar80._4_4_) * 0.33333334;
  auVar55._0_4_ = (float)local_528._0_4_ + (fVar267 + auVar80._0_4_) * 0.33333334;
  auVar55._8_4_ = fStack_520 + (fVar278 + auVar80._8_4_) * 0.33333334;
  auVar55._12_4_ = fStack_51c + (fVar290 + auVar80._12_4_) * 0.33333334;
  _local_3c8 = vfmadd231ps_fma(auVar142,auVar100,auVar55);
  _local_418 = vfmadd231ps_fma(auVar184,auVar100,auVar17);
  _local_428 = vfmadd231ps_fma(auVar162,auVar100,_local_4e8);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar317 = vsubps_avx(local_378,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar317,auVar317,0x55);
  auVar15 = vshufps_avx(auVar317,auVar317,0xaa);
  aVar6 = (pre->ray_space).vy.field_0;
  fVar178 = (pre->ray_space).vz.field_0.m128[0];
  fVar194 = (pre->ray_space).vz.field_0.m128[1];
  fVar195 = (pre->ray_space).vz.field_0.m128[2];
  fVar136 = (pre->ray_space).vz.field_0.m128[3];
  auVar163._0_4_ = fVar178 * auVar15._0_4_;
  auVar163._4_4_ = fVar194 * auVar15._4_4_;
  auVar163._8_4_ = fVar195 * auVar15._8_4_;
  auVar163._12_4_ = fVar136 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar6,auVar21);
  auVar16 = vsubps_avx(local_388,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar16,auVar16,0x55);
  auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar101._0_4_ = fVar178 * auVar15._0_4_;
  auVar101._4_4_ = fVar194 * auVar15._4_4_;
  auVar101._8_4_ = fVar195 * auVar15._8_4_;
  auVar101._12_4_ = fVar136 * auVar15._12_4_;
  auVar138 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar6,auVar21);
  auVar15 = vsubps_avx(local_398,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar120._0_4_ = fVar178 * auVar21._0_4_;
  auVar120._4_4_ = fVar194 * auVar21._4_4_;
  auVar120._8_4_ = fVar195 * auVar21._8_4_;
  auVar120._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar15,auVar15,0x55);
  auVar124 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar6,auVar21);
  auVar17 = vsubps_avx(local_3a8,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar143._0_4_ = fVar178 * auVar21._0_4_;
  auVar143._4_4_ = fVar194 * auVar21._4_4_;
  auVar143._8_4_ = fVar195 * auVar21._8_4_;
  auVar143._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar17,auVar17,0x55);
  auVar75 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar6,auVar21);
  auVar183 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar183,auVar183,0xaa);
  auVar185._0_4_ = fVar178 * auVar21._0_4_;
  auVar185._4_4_ = fVar194 * auVar21._4_4_;
  auVar185._8_4_ = fVar195 * auVar21._8_4_;
  auVar185._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar183,auVar183,0x55);
  auVar76 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar6,auVar21);
  auVar18 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar18,auVar18,0xaa);
  auVar261._0_4_ = fVar178 * auVar21._0_4_;
  auVar261._4_4_ = fVar194 * auVar21._4_4_;
  auVar261._8_4_ = fVar195 * auVar21._8_4_;
  auVar261._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar18,auVar18,0x55);
  auVar249 = vfmadd231ps_fma(auVar261,(undefined1  [16])aVar6,auVar21);
  auVar182 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar182,auVar182,0xaa);
  auVar291._0_4_ = fVar178 * auVar21._0_4_;
  auVar291._4_4_ = fVar194 * auVar21._4_4_;
  auVar291._8_4_ = fVar195 * auVar21._8_4_;
  auVar291._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar182,auVar182,0x55);
  auVar74 = vfmadd231ps_fma(auVar291,(undefined1  [16])aVar6,auVar21);
  auVar19 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar228._0_4_ = fVar178 * auVar21._0_4_;
  auVar228._4_4_ = fVar194 * auVar21._4_4_;
  auVar228._8_4_ = fVar195 * auVar21._8_4_;
  auVar228._12_4_ = fVar136 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar19,auVar19,0x55);
  auVar21 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar6,auVar21);
  local_528._0_4_ = auVar317._0_4_;
  auVar202._4_4_ = local_528._0_4_;
  auVar202._0_4_ = local_528._0_4_;
  auVar202._8_4_ = local_528._0_4_;
  auVar202._12_4_ = local_528._0_4_;
  aVar6 = (pre->ray_space).vx.field_0;
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar202);
  local_508 = auVar16._0_4_;
  auVar203._4_4_ = local_508;
  auVar203._0_4_ = local_508;
  auVar203._8_4_ = local_508;
  auVar203._12_4_ = local_508;
  auVar138 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar6,auVar203);
  uVar73 = auVar15._0_4_;
  auVar204._4_4_ = uVar73;
  auVar204._0_4_ = uVar73;
  auVar204._8_4_ = uVar73;
  auVar204._12_4_ = uVar73;
  auVar124 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar6,auVar204);
  uVar73 = auVar17._0_4_;
  auVar205._4_4_ = uVar73;
  auVar205._0_4_ = uVar73;
  auVar205._8_4_ = uVar73;
  auVar205._12_4_ = uVar73;
  auVar75 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar205);
  uVar73 = auVar183._0_4_;
  auVar206._4_4_ = uVar73;
  auVar206._0_4_ = uVar73;
  auVar206._8_4_ = uVar73;
  auVar206._12_4_ = uVar73;
  auVar76 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar206);
  uVar73 = auVar18._0_4_;
  auVar207._4_4_ = uVar73;
  auVar207._0_4_ = uVar73;
  auVar207._8_4_ = uVar73;
  auVar207._12_4_ = uVar73;
  auVar18 = vfmadd231ps_fma(auVar249,(undefined1  [16])aVar6,auVar207);
  auVar82._0_4_ = auVar182._0_4_;
  auVar82._4_4_ = auVar82._0_4_;
  auVar82._8_4_ = auVar82._0_4_;
  auVar82._12_4_ = auVar82._0_4_;
  auVar182 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar82);
  uVar73 = auVar19._0_4_;
  auVar83._4_4_ = uVar73;
  auVar83._0_4_ = uVar73;
  auVar83._8_4_ = uVar73;
  auVar83._12_4_ = uVar73;
  auVar19 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar83);
  auVar16 = vmovlhps_avx(auVar20,auVar76);
  auVar17 = vmovlhps_avx(auVar138,auVar18);
  auVar183 = vmovlhps_avx(auVar124,auVar182);
  _local_2c8 = vmovlhps_avx(auVar75,auVar19);
  auVar321 = ZEXT1664(_local_2c8);
  auVar21 = vminps_avx(auVar16,auVar17);
  auVar15 = vminps_avx(auVar183,_local_2c8);
  auVar317 = vminps_avx(auVar21,auVar15);
  auVar21 = vmaxps_avx(auVar16,auVar17);
  auVar15 = vmaxps_avx(auVar183,_local_2c8);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vshufpd_avx(auVar317,auVar317,3);
  auVar317 = vminps_avx(auVar317,auVar15);
  auVar15 = vshufpd_avx(auVar21,auVar21,3);
  auVar15 = vmaxps_avx(auVar21,auVar15);
  auVar21 = vandps_avx(local_338,auVar317);
  auVar15 = vandps_avx(local_338,auVar15);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vmovshdup_avx(auVar21);
  auVar21 = vmaxss_avx(auVar15,auVar21);
  auVar72 = (undefined1  [8])((ulong)uVar61 + 0xf);
  local_198 = auVar21._0_4_ * 9.536743e-07;
  local_3d8._0_8_ = auVar20._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._8_8_ = auVar138._0_8_;
  local_3e8._0_8_ = auVar138._0_8_;
  local_3f8._8_8_ = auVar124._0_8_;
  local_3f8._0_8_ = auVar124._0_8_;
  local_408._8_8_ = auVar75._0_8_;
  local_408._0_8_ = auVar75._0_8_;
  local_218 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_368;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  uVar65 = 0;
  local_348 = vsubps_avx(auVar17,auVar16);
  local_358 = vsubps_avx(auVar183,auVar17);
  local_208 = vsubps_avx(_local_2c8,auVar183);
  local_238 = vsubps_avx(_local_3b8,local_378);
  local_248 = vsubps_avx(_local_3c8,local_388);
  local_258 = vsubps_avx(_local_418,local_398);
  _local_268 = vsubps_avx(_local_428,local_3a8);
  _local_528 = ZEXT816(0x3f80000000000000);
  local_228 = _local_528;
  do {
    auVar21 = vshufps_avx(_local_528,_local_528,0x50);
    auVar144._8_4_ = 0x3f800000;
    auVar144._0_8_ = &DAT_3f8000003f800000;
    auVar144._12_4_ = 0x3f800000;
    auVar151._16_4_ = 0x3f800000;
    auVar151._0_16_ = auVar144;
    auVar151._20_4_ = 0x3f800000;
    auVar151._24_4_ = 0x3f800000;
    auVar151._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar144,auVar21);
    fVar178 = auVar21._0_4_;
    fVar290 = auVar76._0_4_;
    auVar84._0_4_ = fVar290 * fVar178;
    fVar194 = auVar21._4_4_;
    fVar299 = auVar76._4_4_;
    auVar84._4_4_ = fVar299 * fVar194;
    fVar195 = auVar21._8_4_;
    auVar84._8_4_ = fVar290 * fVar195;
    fVar136 = auVar21._12_4_;
    auVar84._12_4_ = fVar299 * fVar136;
    fVar219 = auVar18._0_4_;
    auVar186._0_4_ = fVar219 * fVar178;
    fVar241 = auVar18._4_4_;
    auVar186._4_4_ = fVar241 * fVar194;
    auVar186._8_4_ = fVar219 * fVar195;
    auVar186._12_4_ = fVar241 * fVar136;
    fVar258 = auVar182._0_4_;
    auVar229._0_4_ = fVar258 * fVar178;
    fVar267 = auVar182._4_4_;
    auVar229._4_4_ = fVar267 * fVar194;
    auVar229._8_4_ = fVar258 * fVar195;
    auVar229._12_4_ = fVar267 * fVar136;
    fVar268 = auVar19._0_4_;
    auVar271._0_4_ = fVar268 * fVar178;
    fVar278 = auVar19._4_4_;
    auVar271._4_4_ = fVar278 * fVar194;
    auVar271._8_4_ = fVar268 * fVar195;
    auVar271._12_4_ = fVar278 * fVar136;
    auVar138 = vfmadd231ps_fma(auVar84,auVar15,local_3d8);
    auVar124 = vfmadd231ps_fma(auVar186,auVar15,local_3e8);
    auVar75 = vfmadd231ps_fma(auVar229,auVar15,local_3f8);
    auVar249 = vfmadd231ps_fma(auVar271,local_408,auVar15);
    local_458 = auVar249._0_4_;
    auVar21 = vmovshdup_avx(local_228);
    fVar178 = local_228._0_4_;
    fVar112 = (auVar21._0_4_ - fVar178) * 0.04761905;
    auVar257._4_4_ = fVar178;
    auVar257._0_4_ = fVar178;
    auVar257._8_4_ = fVar178;
    auVar257._12_4_ = fVar178;
    auVar257._16_4_ = fVar178;
    auVar257._20_4_ = fVar178;
    auVar257._24_4_ = fVar178;
    auVar257._28_4_ = fVar178;
    auVar130._0_8_ = auVar21._0_8_;
    auVar130._8_8_ = auVar130._0_8_;
    auVar130._16_8_ = auVar130._0_8_;
    auVar130._24_8_ = auVar130._0_8_;
    auVar87 = vsubps_avx(auVar130,auVar257);
    uVar73 = auVar138._0_4_;
    auVar328._4_4_ = uVar73;
    auVar328._0_4_ = uVar73;
    auVar328._8_4_ = uVar73;
    auVar328._12_4_ = uVar73;
    auVar328._16_4_ = uVar73;
    auVar328._20_4_ = uVar73;
    auVar328._24_4_ = uVar73;
    auVar328._28_4_ = uVar73;
    auVar21 = vmovshdup_avx(auVar138);
    uVar196 = auVar21._0_8_;
    auVar309._8_8_ = uVar196;
    auVar309._0_8_ = uVar196;
    auVar309._16_8_ = uVar196;
    auVar309._24_8_ = uVar196;
    fVar111 = auVar124._0_4_;
    auVar109._4_4_ = fVar111;
    auVar109._0_4_ = fVar111;
    auVar109._8_4_ = fVar111;
    auVar109._12_4_ = fVar111;
    auVar109._16_4_ = fVar111;
    auVar109._20_4_ = fVar111;
    auVar109._24_4_ = fVar111;
    auVar109._28_4_ = fVar111;
    auVar15 = vmovshdup_avx(auVar124);
    auVar211._0_8_ = auVar15._0_8_;
    auVar211._8_8_ = auVar211._0_8_;
    auVar211._16_8_ = auVar211._0_8_;
    auVar211._24_8_ = auVar211._0_8_;
    fVar135 = auVar75._0_4_;
    auVar289._4_4_ = fVar135;
    auVar289._0_4_ = fVar135;
    auVar289._8_4_ = fVar135;
    auVar289._12_4_ = fVar135;
    auVar289._16_4_ = fVar135;
    auVar289._20_4_ = fVar135;
    auVar289._24_4_ = fVar135;
    auVar289._28_4_ = fVar135;
    auVar317 = vmovshdup_avx(auVar75);
    auVar266._0_8_ = auVar317._0_8_;
    auVar266._8_8_ = auVar266._0_8_;
    auVar266._16_8_ = auVar266._0_8_;
    auVar266._24_8_ = auVar266._0_8_;
    auVar20 = vmovshdup_avx(auVar249);
    auVar74 = vfmadd132ps_fma(auVar87,auVar257,_DAT_02020f20);
    auVar87 = vsubps_avx(auVar151,ZEXT1632(auVar74));
    fVar178 = auVar74._0_4_;
    auVar322._0_4_ = fVar111 * fVar178;
    fVar194 = auVar74._4_4_;
    auVar322._4_4_ = fVar111 * fVar194;
    fVar195 = auVar74._8_4_;
    auVar322._8_4_ = fVar111 * fVar195;
    fVar136 = auVar74._12_4_;
    auVar322._12_4_ = fVar111 * fVar136;
    auVar322._16_4_ = fVar111 * 0.0;
    auVar322._20_4_ = fVar111 * 0.0;
    auVar322._28_36_ = auVar321._28_36_;
    auVar322._24_4_ = fVar111 * 0.0;
    auVar74 = vfmadd231ps_fma(auVar322._0_32_,auVar87,auVar328);
    fVar133 = auVar15._0_4_;
    fVar134 = auVar15._4_4_;
    auVar22._4_4_ = fVar134 * fVar194;
    auVar22._0_4_ = fVar133 * fVar178;
    auVar22._8_4_ = fVar133 * fVar195;
    auVar22._12_4_ = fVar134 * fVar136;
    auVar22._16_4_ = fVar133 * 0.0;
    auVar22._20_4_ = fVar134 * 0.0;
    auVar22._24_4_ = fVar133 * 0.0;
    auVar22._28_4_ = local_458;
    auVar88 = vfmadd231ps_fma(auVar22,auVar87,auVar309);
    auVar23._4_4_ = fVar135 * fVar194;
    auVar23._0_4_ = fVar135 * fVar178;
    auVar23._8_4_ = fVar135 * fVar195;
    auVar23._12_4_ = fVar135 * fVar136;
    auVar23._16_4_ = fVar135 * 0.0;
    auVar23._20_4_ = fVar135 * 0.0;
    auVar23._24_4_ = fVar135 * 0.0;
    auVar23._28_4_ = auVar21._4_4_;
    auVar89 = vfmadd231ps_fma(auVar23,auVar87,auVar109);
    fVar133 = auVar317._0_4_;
    fVar134 = auVar317._4_4_;
    auVar24._4_4_ = fVar134 * fVar194;
    auVar24._0_4_ = fVar133 * fVar178;
    auVar24._8_4_ = fVar133 * fVar195;
    auVar24._12_4_ = fVar134 * fVar136;
    auVar24._16_4_ = fVar133 * 0.0;
    auVar24._20_4_ = fVar134 * 0.0;
    auVar24._24_4_ = fVar133 * 0.0;
    auVar24._28_4_ = uVar73;
    auVar166 = vfmadd231ps_fma(auVar24,auVar87,auVar211);
    auVar21 = vshufps_avx(auVar138,auVar138,0xaa);
    auVar212._0_8_ = auVar21._0_8_;
    auVar212._8_8_ = auVar212._0_8_;
    auVar212._16_8_ = auVar212._0_8_;
    auVar212._24_8_ = auVar212._0_8_;
    auVar15 = vshufps_avx(auVar138,auVar138,0xff);
    uStack_4e0 = auVar15._0_8_;
    local_4e8 = (undefined1  [8])uStack_4e0;
    uStack_4d8 = uStack_4e0;
    uStack_4d0 = uStack_4e0;
    auVar25._4_4_ = fVar194 * local_458;
    auVar25._0_4_ = fVar178 * local_458;
    auVar25._8_4_ = fVar195 * local_458;
    auVar25._12_4_ = fVar136 * local_458;
    auVar25._16_4_ = local_458 * 0.0;
    auVar25._20_4_ = local_458 * 0.0;
    auVar25._24_4_ = local_458 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar95 = vfmadd231ps_fma(auVar25,auVar87,auVar289);
    auVar317 = vshufps_avx(auVar124,auVar124,0xaa);
    auVar173._0_8_ = auVar317._0_8_;
    auVar173._8_8_ = auVar173._0_8_;
    auVar173._16_8_ = auVar173._0_8_;
    auVar173._24_8_ = auVar173._0_8_;
    auVar138 = vshufps_avx(auVar124,auVar124,0xff);
    auVar193._0_8_ = auVar138._0_8_;
    auVar193._8_8_ = auVar193._0_8_;
    auVar193._16_8_ = auVar193._0_8_;
    auVar193._24_8_ = auVar193._0_8_;
    fVar133 = auVar20._0_4_;
    fVar134 = auVar20._4_4_;
    auVar26._4_4_ = fVar134 * fVar194;
    auVar26._0_4_ = fVar133 * fVar178;
    auVar26._8_4_ = fVar133 * fVar195;
    auVar26._12_4_ = fVar134 * fVar136;
    auVar26._16_4_ = fVar133 * 0.0;
    auVar26._20_4_ = fVar134 * 0.0;
    auVar26._24_4_ = fVar133 * 0.0;
    auVar26._28_4_ = fVar135;
    auVar113 = vfmadd231ps_fma(auVar26,auVar87,auVar266);
    auVar27._28_4_ = fVar111;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * fVar136,
                            CONCAT48(auVar89._8_4_ * fVar195,
                                     CONCAT44(auVar89._4_4_ * fVar194,auVar89._0_4_ * fVar178))));
    auVar74 = vfmadd231ps_fma(auVar27,auVar87,ZEXT1632(auVar74));
    auVar298._28_4_ = auVar15._4_4_;
    auVar298._0_28_ =
         ZEXT1628(CONCAT412(auVar166._12_4_ * fVar136,
                            CONCAT48(auVar166._8_4_ * fVar195,
                                     CONCAT44(auVar166._4_4_ * fVar194,auVar166._0_4_ * fVar178))));
    auVar88 = vfmadd231ps_fma(auVar298,auVar87,ZEXT1632(auVar88));
    auVar15 = vshufps_avx(auVar75,auVar75,0xaa);
    uVar196 = auVar15._0_8_;
    auVar297._8_8_ = uVar196;
    auVar297._0_8_ = uVar196;
    auVar297._16_8_ = uVar196;
    auVar297._24_8_ = uVar196;
    auVar20 = vshufps_avx(auVar75,auVar75,0xff);
    uVar196 = auVar20._0_8_;
    auVar319._8_8_ = uVar196;
    auVar319._0_8_ = uVar196;
    auVar319._16_8_ = uVar196;
    auVar319._24_8_ = uVar196;
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar95._12_4_,
                                                 CONCAT48(fVar195 * auVar95._8_4_,
                                                          CONCAT44(fVar194 * auVar95._4_4_,
                                                                   fVar178 * auVar95._0_4_)))),
                              auVar87,ZEXT1632(auVar89));
    auVar124 = vshufps_avx(auVar249,auVar249,0xaa);
    auVar75 = vshufps_avx(auVar249,auVar249,0xff);
    local_458 = auVar75._0_4_;
    fStack_454 = auVar75._4_4_;
    auVar29._28_4_ = fStack_454;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar113._12_4_ * fVar136,
                            CONCAT48(auVar113._8_4_ * fVar195,
                                     CONCAT44(auVar113._4_4_ * fVar194,auVar113._0_4_ * fVar178))));
    auVar75 = vfmadd231ps_fma(auVar29,auVar87,ZEXT1632(auVar166));
    auVar249 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar89._12_4_,
                                                  CONCAT48(fVar195 * auVar89._8_4_,
                                                           CONCAT44(fVar194 * auVar89._4_4_,
                                                                    fVar178 * auVar89._0_4_)))),
                               auVar87,ZEXT1632(auVar74));
    auVar22 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar74));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar75._12_4_,
                                                 CONCAT48(fVar195 * auVar75._8_4_,
                                                          CONCAT44(fVar194 * auVar75._4_4_,
                                                                   fVar178 * auVar75._0_4_)))),
                              auVar87,ZEXT1632(auVar88));
    auVar23 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar88));
    fVar135 = fVar112 * auVar22._0_4_ * 3.0;
    fVar154 = fVar112 * auVar22._4_4_ * 3.0;
    auVar30._4_4_ = fVar154;
    auVar30._0_4_ = fVar135;
    fStack_450 = fVar112 * auVar22._8_4_ * 3.0;
    auVar30._8_4_ = fStack_450;
    fStack_44c = fVar112 * auVar22._12_4_ * 3.0;
    auVar30._12_4_ = fStack_44c;
    fStack_448 = fVar112 * auVar22._16_4_ * 3.0;
    auVar30._16_4_ = fStack_448;
    fStack_444 = fVar112 * auVar22._20_4_ * 3.0;
    auVar30._20_4_ = fStack_444;
    fStack_440 = fVar112 * auVar22._24_4_ * 3.0;
    auVar30._24_4_ = fStack_440;
    auVar30._28_4_ = 0x40400000;
    local_478._0_4_ = fVar112 * auVar23._0_4_ * 3.0;
    local_478._4_4_ = fVar112 * auVar23._4_4_ * 3.0;
    fStack_470 = fVar112 * auVar23._8_4_ * 3.0;
    fStack_46c = fVar112 * auVar23._12_4_ * 3.0;
    fStack_468 = fVar112 * auVar23._16_4_ * 3.0;
    fStack_464 = fVar112 * auVar23._20_4_ * 3.0;
    fStack_460 = fVar112 * auVar23._24_4_ * 3.0;
    fStack_45c = auVar23._28_4_;
    fVar111 = auVar317._0_4_;
    fVar133 = auVar317._4_4_;
    auVar31._4_4_ = fVar133 * fVar194;
    auVar31._0_4_ = fVar111 * fVar178;
    auVar31._8_4_ = fVar111 * fVar195;
    auVar31._12_4_ = fVar133 * fVar136;
    auVar31._16_4_ = fVar111 * 0.0;
    auVar31._20_4_ = fVar133 * 0.0;
    auVar31._24_4_ = fVar111 * 0.0;
    auVar31._28_4_ = auVar22._28_4_;
    auVar317 = vfmadd231ps_fma(auVar31,auVar87,auVar212);
    fVar111 = auVar138._0_4_;
    fVar134 = auVar138._4_4_;
    auVar32._4_4_ = fVar134 * fVar194;
    auVar32._0_4_ = fVar111 * fVar178;
    auVar32._8_4_ = fVar111 * fVar195;
    auVar32._12_4_ = fVar134 * fVar136;
    auVar32._16_4_ = fVar111 * 0.0;
    auVar32._20_4_ = fVar134 * 0.0;
    auVar32._24_4_ = fVar111 * 0.0;
    auVar32._28_4_ = auVar21._4_4_;
    auVar21 = vfmadd231ps_fma(auVar32,auVar87,_local_4e8);
    fVar111 = auVar15._0_4_;
    fVar134 = auVar15._4_4_;
    auVar33._4_4_ = fVar134 * fVar194;
    auVar33._0_4_ = fVar111 * fVar178;
    auVar33._8_4_ = fVar111 * fVar195;
    auVar33._12_4_ = fVar134 * fVar136;
    auVar33._16_4_ = fVar111 * 0.0;
    auVar33._20_4_ = fVar134 * 0.0;
    auVar33._24_4_ = fVar111 * 0.0;
    auVar33._28_4_ = fVar112;
    auVar15 = vfmadd231ps_fma(auVar33,auVar87,auVar173);
    fVar111 = auVar20._0_4_;
    fVar175 = auVar20._4_4_;
    auVar34._4_4_ = fVar175 * fVar194;
    auVar34._0_4_ = fVar111 * fVar178;
    auVar34._8_4_ = fVar111 * fVar195;
    auVar34._12_4_ = fVar175 * fVar136;
    auVar34._16_4_ = fVar111 * 0.0;
    auVar34._20_4_ = fVar175 * 0.0;
    auVar34._24_4_ = fVar111 * 0.0;
    auVar34._28_4_ = fVar133;
    auVar20 = vfmadd231ps_fma(auVar34,auVar87,auVar193);
    local_328 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar249));
    fVar111 = auVar124._0_4_;
    fVar133 = auVar124._4_4_;
    auVar35._4_4_ = fVar133 * fVar194;
    auVar35._0_4_ = fVar111 * fVar178;
    auVar35._8_4_ = fVar111 * fVar195;
    auVar35._12_4_ = fVar133 * fVar136;
    auVar35._16_4_ = fVar111 * 0.0;
    auVar35._20_4_ = fVar133 * 0.0;
    auVar35._24_4_ = fVar111 * 0.0;
    auVar35._28_4_ = local_328._28_4_;
    auVar138 = vfmadd231ps_fma(auVar35,auVar87,auVar297);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar74));
    auVar36._4_4_ = fVar194 * fStack_454;
    auVar36._0_4_ = fVar178 * local_458;
    auVar36._8_4_ = fVar195 * local_458;
    auVar36._12_4_ = fVar136 * fStack_454;
    auVar36._16_4_ = local_458 * 0.0;
    auVar36._20_4_ = fStack_454 * 0.0;
    auVar36._24_4_ = local_458 * 0.0;
    auVar36._28_4_ = fVar134;
    auVar124 = vfmadd231ps_fma(auVar36,auVar87,auVar319);
    auVar37._28_4_ = fVar133;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar136 * auVar15._12_4_,
                            CONCAT48(fVar195 * auVar15._8_4_,
                                     CONCAT44(fVar194 * auVar15._4_4_,fVar178 * auVar15._0_4_))));
    auVar317 = vfmadd231ps_fma(auVar37,auVar87,ZEXT1632(auVar317));
    auVar21 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar20._12_4_,
                                                 CONCAT48(fVar195 * auVar20._8_4_,
                                                          CONCAT44(fVar194 * auVar20._4_4_,
                                                                   fVar178 * auVar20._0_4_)))),
                              auVar87,ZEXT1632(auVar21));
    local_458 = auVar249._0_4_ + fVar135;
    fStack_454 = auVar249._4_4_ + fVar154;
    fStack_450 = auVar249._8_4_ + fStack_450;
    fStack_44c = auVar249._12_4_ + fStack_44c;
    fStack_448 = fStack_448 + 0.0;
    fStack_444 = fStack_444 + 0.0;
    fStack_440 = fStack_440 + 0.0;
    uStack_43c = 0x40400000;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar124._12_4_ * fVar136,
                            CONCAT48(auVar124._8_4_ * fVar195,
                                     CONCAT44(auVar124._4_4_ * fVar194,auVar124._0_4_ * fVar178))));
    auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar138._12_4_,
                                                 CONCAT48(fVar195 * auVar138._8_4_,
                                                          CONCAT44(fVar194 * auVar138._4_4_,
                                                                   fVar178 * auVar138._0_4_)))),
                              auVar87,ZEXT1632(auVar15));
    auVar20 = vfmadd231ps_fma(auVar38,auVar87,ZEXT1632(auVar20));
    auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar15._12_4_,
                                                  CONCAT48(fVar195 * auVar15._8_4_,
                                                           CONCAT44(fVar194 * auVar15._4_4_,
                                                                    fVar178 * auVar15._0_4_)))),
                               auVar87,ZEXT1632(auVar317));
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar136 * auVar20._12_4_,
                                                  CONCAT48(fVar195 * auVar20._8_4_,
                                                           CONCAT44(fVar194 * auVar20._4_4_,
                                                                    fVar178 * auVar20._0_4_)))),
                               ZEXT1632(auVar21),auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar317));
    auVar22 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
    fVar178 = fVar112 * auVar87._0_4_ * 3.0;
    fVar194 = fVar112 * auVar87._4_4_ * 3.0;
    auVar39._4_4_ = fVar194;
    auVar39._0_4_ = fVar178;
    fVar195 = fVar112 * auVar87._8_4_ * 3.0;
    auVar39._8_4_ = fVar195;
    fVar136 = fVar112 * auVar87._12_4_ * 3.0;
    auVar39._12_4_ = fVar136;
    fVar135 = fVar112 * auVar87._16_4_ * 3.0;
    auVar39._16_4_ = fVar135;
    fVar154 = fVar112 * auVar87._20_4_ * 3.0;
    auVar39._20_4_ = fVar154;
    fVar175 = fVar112 * auVar87._24_4_ * 3.0;
    auVar39._24_4_ = fVar175;
    auVar39._28_4_ = 0x40400000;
    auVar240._0_4_ = fVar112 * auVar22._0_4_ * 3.0;
    auVar240._4_4_ = fVar112 * auVar22._4_4_ * 3.0;
    auVar240._8_4_ = fVar112 * auVar22._8_4_ * 3.0;
    auVar240._12_4_ = fVar112 * auVar22._12_4_ * 3.0;
    auVar240._16_4_ = fVar112 * auVar22._16_4_ * 3.0;
    auVar240._20_4_ = fVar112 * auVar22._20_4_ * 3.0;
    auVar240._24_4_ = fVar112 * auVar22._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar138));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar124));
    auVar87 = vsubps_avx(ZEXT1632(auVar138),ZEXT1632(auVar249));
    auVar22 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar74));
    auVar24 = vsubps_avx(auVar27,local_328);
    fVar176 = auVar87._0_4_ + auVar24._0_4_;
    fVar177 = auVar87._4_4_ + auVar24._4_4_;
    fVar214 = auVar87._8_4_ + auVar24._8_4_;
    fVar215 = auVar87._12_4_ + auVar24._12_4_;
    fVar216 = auVar87._16_4_ + auVar24._16_4_;
    fVar217 = auVar87._20_4_ + auVar24._20_4_;
    fVar218 = auVar87._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(local_78,auVar26);
    auVar310._0_4_ = auVar22._0_4_ + auVar25._0_4_;
    auVar310._4_4_ = auVar22._4_4_ + auVar25._4_4_;
    auVar310._8_4_ = auVar22._8_4_ + auVar25._8_4_;
    auVar310._12_4_ = auVar22._12_4_ + auVar25._12_4_;
    auVar310._16_4_ = auVar22._16_4_ + auVar25._16_4_;
    auVar310._20_4_ = auVar22._20_4_ + auVar25._20_4_;
    auVar310._24_4_ = auVar22._24_4_ + auVar25._24_4_;
    auVar310._28_4_ = auVar22._28_4_ + auVar25._28_4_;
    fVar112 = auVar74._0_4_;
    local_158 = fVar112 + (float)local_478._0_4_;
    fVar111 = auVar74._4_4_;
    fStack_154 = fVar111 + (float)local_478._4_4_;
    fVar133 = auVar74._8_4_;
    fStack_150 = fVar133 + fStack_470;
    fVar134 = auVar74._12_4_;
    fStack_14c = fVar134 + fStack_46c;
    fStack_148 = fStack_468 + 0.0;
    fStack_144 = fStack_464 + 0.0;
    fStack_140 = fStack_460 + 0.0;
    fStack_13c = auVar23._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar249);
    auVar22 = vsubps_avx(local_98,auVar30);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_b8 = ZEXT1632(auVar74);
    auVar22 = vsubps_avx(local_b8,_local_478);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_f8._0_4_ = auVar138._0_4_ + fVar178;
    local_f8._4_4_ = auVar138._4_4_ + fVar194;
    local_f8._8_4_ = auVar138._8_4_ + fVar195;
    local_f8._12_4_ = auVar138._12_4_ + fVar136;
    local_f8._16_4_ = fVar135 + 0.0;
    local_f8._20_4_ = fVar154 + 0.0;
    local_f8._24_4_ = fVar175 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar298 = ZEXT1632(auVar138);
    auVar22 = vsubps_avx(auVar298,auVar39);
    _local_478 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    fVar178 = auVar124._0_4_;
    local_138._0_4_ = fVar178 + auVar240._0_4_;
    fVar194 = auVar124._4_4_;
    local_138._4_4_ = fVar194 + auVar240._4_4_;
    fVar195 = auVar124._8_4_;
    local_138._8_4_ = fVar195 + auVar240._8_4_;
    fVar136 = auVar124._12_4_;
    local_138._12_4_ = fVar136 + auVar240._12_4_;
    local_138._16_4_ = auVar240._16_4_ + 0.0;
    local_138._20_4_ = auVar240._20_4_ + 0.0;
    local_138._24_4_ = auVar240._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar22 = vsubps_avx(ZEXT1632(auVar124),auVar240);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    auVar40._4_4_ = fVar111 * fVar177;
    auVar40._0_4_ = fVar112 * fVar176;
    auVar40._8_4_ = fVar133 * fVar214;
    auVar40._12_4_ = fVar134 * fVar215;
    auVar40._16_4_ = fVar216 * 0.0;
    auVar40._20_4_ = fVar217 * 0.0;
    auVar40._24_4_ = fVar218 * 0.0;
    auVar40._28_4_ = auVar22._28_4_;
    auVar21 = vfnmadd231ps_fma(auVar40,local_98,auVar310);
    auVar41._4_4_ = fStack_154 * fVar177;
    auVar41._0_4_ = local_158 * fVar176;
    auVar41._8_4_ = fStack_150 * fVar214;
    auVar41._12_4_ = fStack_14c * fVar215;
    auVar41._16_4_ = fStack_148 * fVar216;
    auVar41._20_4_ = fStack_144 * fVar217;
    auVar41._24_4_ = fStack_140 * fVar218;
    auVar41._28_4_ = local_478._28_4_;
    auVar56._4_4_ = fStack_454;
    auVar56._0_4_ = local_458;
    auVar56._8_4_ = fStack_450;
    auVar56._12_4_ = fStack_44c;
    auVar56._16_4_ = fStack_448;
    auVar56._20_4_ = fStack_444;
    auVar56._24_4_ = fStack_440;
    auVar56._28_4_ = 0x40400000;
    auVar15 = vfnmadd231ps_fma(auVar41,auVar310,auVar56);
    auVar42._4_4_ = local_178._4_4_ * fVar177;
    auVar42._0_4_ = local_178._0_4_ * fVar176;
    auVar42._8_4_ = local_178._8_4_ * fVar214;
    auVar42._12_4_ = local_178._12_4_ * fVar215;
    auVar42._16_4_ = local_178._16_4_ * fVar216;
    auVar42._20_4_ = local_178._20_4_ * fVar217;
    auVar42._24_4_ = local_178._24_4_ * fVar218;
    auVar42._28_4_ = fStack_13c;
    auVar317 = vfnmadd231ps_fma(auVar42,local_d8,auVar310);
    local_4e8._0_4_ = auVar26._0_4_;
    local_4e8._4_4_ = auVar26._4_4_;
    uStack_4e0._0_4_ = auVar26._8_4_;
    uStack_4e0._4_4_ = auVar26._12_4_;
    uStack_4d8._0_4_ = auVar26._16_4_;
    uStack_4d8._4_4_ = auVar26._20_4_;
    uStack_4d0._0_4_ = auVar26._24_4_;
    auVar43._4_4_ = fVar177 * (float)local_4e8._4_4_;
    auVar43._0_4_ = fVar176 * (float)local_4e8._0_4_;
    auVar43._8_4_ = fVar214 * (float)uStack_4e0;
    auVar43._12_4_ = fVar215 * uStack_4e0._4_4_;
    auVar43._16_4_ = fVar216 * (float)uStack_4d8;
    auVar43._20_4_ = fVar217 * uStack_4d8._4_4_;
    auVar43._24_4_ = fVar218 * (float)uStack_4d0;
    auVar43._28_4_ = local_178._28_4_;
    auVar20 = vfnmadd231ps_fma(auVar43,local_328,auVar310);
    auVar60._4_4_ = fVar194 * fVar177;
    auVar60._0_4_ = fVar178 * fVar176;
    auVar60._8_4_ = fVar195 * fVar214;
    auVar60._12_4_ = fVar136 * fVar215;
    auVar60._16_4_ = fVar216 * 0.0;
    auVar60._20_4_ = fVar217 * 0.0;
    auVar60._24_4_ = fVar218 * 0.0;
    auVar60._28_4_ = DAT_0205d4a0._28_4_;
    auVar138 = vfnmadd231ps_fma(auVar60,auVar298,auVar310);
    auVar44._4_4_ = local_138._4_4_ * fVar177;
    auVar44._0_4_ = local_138._0_4_ * fVar176;
    auVar44._8_4_ = local_138._8_4_ * fVar214;
    auVar44._12_4_ = local_138._12_4_ * fVar215;
    auVar44._16_4_ = local_138._16_4_ * fVar216;
    auVar44._20_4_ = local_138._20_4_ * fVar217;
    auVar44._24_4_ = local_138._24_4_ * fVar218;
    auVar44._28_4_ = local_328._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar44,local_f8,auVar310);
    auVar45._4_4_ = local_118._4_4_ * fVar177;
    auVar45._0_4_ = local_118._0_4_ * fVar176;
    auVar45._8_4_ = local_118._8_4_ * fVar214;
    auVar45._12_4_ = local_118._12_4_ * fVar215;
    auVar45._16_4_ = local_118._16_4_ * fVar216;
    auVar45._20_4_ = local_118._20_4_ * fVar217;
    auVar45._24_4_ = local_118._24_4_ * fVar218;
    auVar45._28_4_ = local_d8._28_4_;
    auVar249 = vfnmadd231ps_fma(auVar45,auVar310,_local_478);
    auVar46._4_4_ = local_78._4_4_ * fVar177;
    auVar46._0_4_ = local_78._0_4_ * fVar176;
    auVar46._8_4_ = local_78._8_4_ * fVar214;
    auVar46._12_4_ = local_78._12_4_ * fVar215;
    auVar46._16_4_ = local_78._16_4_ * fVar216;
    auVar46._20_4_ = local_78._20_4_ * fVar217;
    auVar46._24_4_ = local_78._24_4_ * fVar218;
    auVar46._28_4_ = auVar87._28_4_ + auVar24._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar46,auVar310,auVar27);
    auVar22 = vminps_avx(ZEXT1632(auVar21),ZEXT1632(auVar15));
    auVar87 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar15));
    auVar23 = vminps_avx(ZEXT1632(auVar317),ZEXT1632(auVar20));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar317),ZEXT1632(auVar20));
    auVar87 = vmaxps_avx(auVar87,auVar22);
    auVar24 = vminps_avx(ZEXT1632(auVar138),ZEXT1632(auVar75));
    auVar22 = vmaxps_avx(ZEXT1632(auVar138),ZEXT1632(auVar75));
    auVar25 = vminps_avx(ZEXT1632(auVar249),ZEXT1632(auVar74));
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar249),ZEXT1632(auVar74));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar87,auVar22);
    auVar59._4_4_ = fStack_194;
    auVar59._0_4_ = local_198;
    auVar59._8_4_ = fStack_190;
    auVar59._12_4_ = fStack_18c;
    auVar59._16_4_ = fStack_188;
    auVar59._20_4_ = fStack_184;
    auVar59._24_4_ = fStack_180;
    auVar59._28_4_ = fStack_17c;
    auVar87 = vcmpps_avx(auVar24,auVar59,2);
    auVar58._4_4_ = uStack_1b4;
    auVar58._0_4_ = local_1b8;
    auVar58._8_4_ = uStack_1b0;
    auVar58._12_4_ = uStack_1ac;
    auVar58._16_4_ = uStack_1a8;
    auVar58._20_4_ = uStack_1a4;
    auVar58._24_4_ = uStack_1a0;
    auVar58._28_4_ = uStack_19c;
    auVar22 = vcmpps_avx(auVar22,auVar58,5);
    auVar87 = vandps_avx(auVar22,auVar87);
    auVar22 = local_1f8 & auVar87;
    uVar62 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(local_328,local_98);
      auVar23 = vsubps_avx(auVar27,auVar298);
      fVar154 = auVar22._0_4_ + auVar23._0_4_;
      fVar175 = auVar22._4_4_ + auVar23._4_4_;
      fVar176 = auVar22._8_4_ + auVar23._8_4_;
      fVar177 = auVar22._12_4_ + auVar23._12_4_;
      fVar214 = auVar22._16_4_ + auVar23._16_4_;
      fVar215 = auVar22._20_4_ + auVar23._20_4_;
      fVar216 = auVar22._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(auVar26,local_b8);
      auVar25 = vsubps_avx(local_78,ZEXT1632(auVar124));
      auVar110._0_4_ = auVar24._0_4_ + auVar25._0_4_;
      auVar110._4_4_ = auVar24._4_4_ + auVar25._4_4_;
      auVar110._8_4_ = auVar24._8_4_ + auVar25._8_4_;
      auVar110._12_4_ = auVar24._12_4_ + auVar25._12_4_;
      auVar110._16_4_ = auVar24._16_4_ + auVar25._16_4_;
      auVar110._20_4_ = auVar24._20_4_ + auVar25._20_4_;
      auVar110._24_4_ = auVar24._24_4_ + auVar25._24_4_;
      fVar135 = auVar25._28_4_;
      auVar110._28_4_ = auVar24._28_4_ + fVar135;
      auVar320._0_4_ = fVar112 * fVar154;
      auVar320._4_4_ = fVar111 * fVar175;
      auVar320._8_4_ = fVar133 * fVar176;
      auVar320._12_4_ = fVar134 * fVar177;
      auVar320._16_4_ = fVar214 * 0.0;
      auVar320._20_4_ = fVar215 * 0.0;
      auVar320._24_4_ = fVar216 * 0.0;
      auVar320._28_4_ = 0;
      auVar138 = vfnmadd231ps_fma(auVar320,auVar110,local_98);
      auVar47._4_4_ = fVar175 * fStack_154;
      auVar47._0_4_ = fVar154 * local_158;
      auVar47._8_4_ = fVar176 * fStack_150;
      auVar47._12_4_ = fVar177 * fStack_14c;
      auVar47._16_4_ = fVar214 * fStack_148;
      auVar47._20_4_ = fVar215 * fStack_144;
      auVar47._24_4_ = fVar216 * fStack_140;
      auVar47._28_4_ = fVar135;
      auVar57._4_4_ = fStack_454;
      auVar57._0_4_ = local_458;
      auVar57._8_4_ = fStack_450;
      auVar57._12_4_ = fStack_44c;
      auVar57._16_4_ = fStack_448;
      auVar57._20_4_ = fStack_444;
      auVar57._24_4_ = fStack_440;
      auVar57._28_4_ = 0x40400000;
      auVar21 = vfnmadd213ps_fma(auVar57,auVar110,auVar47);
      auVar48._4_4_ = fVar175 * local_178._4_4_;
      auVar48._0_4_ = fVar154 * local_178._0_4_;
      auVar48._8_4_ = fVar176 * local_178._8_4_;
      auVar48._12_4_ = fVar177 * local_178._12_4_;
      auVar48._16_4_ = fVar214 * local_178._16_4_;
      auVar48._20_4_ = fVar215 * local_178._20_4_;
      auVar48._24_4_ = fVar216 * local_178._24_4_;
      auVar48._28_4_ = fVar135;
      auVar15 = vfnmadd213ps_fma(local_d8,auVar110,auVar48);
      auVar49._4_4_ = (float)local_4e8._4_4_ * fVar175;
      auVar49._0_4_ = (float)local_4e8._0_4_ * fVar154;
      auVar49._8_4_ = (float)uStack_4e0 * fVar176;
      auVar49._12_4_ = uStack_4e0._4_4_ * fVar177;
      auVar49._16_4_ = (float)uStack_4d8 * fVar214;
      auVar49._20_4_ = uStack_4d8._4_4_ * fVar215;
      auVar49._24_4_ = (float)uStack_4d0 * fVar216;
      auVar49._28_4_ = fVar135;
      auVar124 = vfnmadd231ps_fma(auVar49,auVar110,local_328);
      auVar131._0_4_ = fVar178 * fVar154;
      auVar131._4_4_ = fVar194 * fVar175;
      auVar131._8_4_ = fVar195 * fVar176;
      auVar131._12_4_ = fVar136 * fVar177;
      auVar131._16_4_ = fVar214 * 0.0;
      auVar131._20_4_ = fVar215 * 0.0;
      auVar131._24_4_ = fVar216 * 0.0;
      auVar131._28_4_ = 0;
      auVar75 = vfnmadd231ps_fma(auVar131,auVar110,auVar298);
      auVar50._4_4_ = fVar175 * local_138._4_4_;
      auVar50._0_4_ = fVar154 * local_138._0_4_;
      auVar50._8_4_ = fVar176 * local_138._8_4_;
      auVar50._12_4_ = fVar177 * local_138._12_4_;
      auVar50._16_4_ = fVar214 * local_138._16_4_;
      auVar50._20_4_ = fVar215 * local_138._20_4_;
      auVar50._24_4_ = fVar216 * local_138._24_4_;
      auVar50._28_4_ = auVar26._28_4_;
      auVar317 = vfnmadd213ps_fma(local_f8,auVar110,auVar50);
      auVar51._4_4_ = fVar175 * local_118._4_4_;
      auVar51._0_4_ = fVar154 * local_118._0_4_;
      auVar51._8_4_ = fVar176 * local_118._8_4_;
      auVar51._12_4_ = fVar177 * local_118._12_4_;
      auVar51._16_4_ = fVar214 * local_118._16_4_;
      auVar51._20_4_ = fVar215 * local_118._20_4_;
      auVar51._24_4_ = fVar216 * local_118._24_4_;
      auVar51._28_4_ = auVar26._28_4_;
      auVar20 = vfnmadd213ps_fma(_local_478,auVar110,auVar51);
      auVar52._4_4_ = local_78._4_4_ * fVar175;
      auVar52._0_4_ = local_78._0_4_ * fVar154;
      auVar52._8_4_ = local_78._8_4_ * fVar176;
      auVar52._12_4_ = local_78._12_4_ * fVar177;
      auVar52._16_4_ = local_78._16_4_ * fVar214;
      auVar52._20_4_ = local_78._20_4_ * fVar215;
      auVar52._24_4_ = local_78._24_4_ * fVar216;
      auVar52._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar249 = vfnmadd231ps_fma(auVar52,auVar110,auVar27);
      auVar23 = vminps_avx(ZEXT1632(auVar138),ZEXT1632(auVar21));
      auVar22 = vmaxps_avx(ZEXT1632(auVar138),ZEXT1632(auVar21));
      auVar24 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar124));
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar124));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar25 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar317));
      auVar23 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar317));
      auVar26 = vminps_avx(ZEXT1632(auVar20),ZEXT1632(auVar249));
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar249));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar25,auVar59,2);
      auVar23 = vcmpps_avx(auVar23,auVar58,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar87 = vandps_avx(auVar87,local_1f8);
      auVar23 = auVar87 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar22,auVar87);
        uVar62 = vmovmskps_avx(auVar87);
      }
    }
    if (uVar62 != 0) {
      auStack_2b8[uVar65] = uVar62;
      uVar196 = vmovlps_avx(local_228);
      *(undefined8 *)(&uStack_1d8 + uVar65 * 2) = uVar196;
      uVar70 = vmovlps_avx(_local_528);
      auStack_58[uVar65] = uVar70;
      uVar65 = (ulong)((int)uVar65 + 1);
    }
    do {
      if ((int)uVar65 == 0) {
        fVar178 = (ray->super_RayK<1>).tfar;
        auVar86._4_4_ = fVar178;
        auVar86._0_4_ = fVar178;
        auVar86._8_4_ = fVar178;
        auVar86._12_4_ = fVar178;
        auVar21 = vcmpps_avx(local_278,auVar86,2);
        uVar64 = vmovmskps_avx(auVar21);
        uVar61 = uVar61 & SUB84(auVar72,0) & uVar64;
        if (uVar61 == 0) {
          return;
        }
        goto LAB_01787e5c;
      }
      uVar63 = (int)uVar65 - 1;
      uVar66 = (ulong)uVar63;
      uVar69 = auStack_2b8[uVar66];
      uVar62 = (&uStack_1d8)[uVar66 * 2];
      fVar178 = afStack_1d4[uVar66 * 2];
      iVar28 = 0;
      for (uVar70 = (ulong)uVar69; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        iVar28 = iVar28 + 1;
      }
      uVar69 = uVar69 - 1 & uVar69;
      if (uVar69 == 0) {
        uVar65 = (ulong)uVar63;
      }
      register0x00001348 = 0;
      local_528 = (undefined1  [8])auStack_58[uVar66];
      auStack_2b8[uVar66] = uVar69;
      fVar194 = (float)(iVar28 + 1) * 0.14285715;
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * (float)iVar28 * 0.14285715)),
                                ZEXT416(uVar62),ZEXT416((uint)(1.0 - (float)iVar28 * 0.14285715)));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar194)),ZEXT416(uVar62),
                                ZEXT416((uint)(1.0 - fVar194)));
      auVar213._0_4_ = auVar21._0_4_;
      local_458 = auVar15._0_4_;
      fVar178 = local_458 - auVar213._0_4_;
      fStack_454 = auVar15._4_4_;
      fStack_450 = auVar15._8_4_;
      fStack_44c = auVar15._12_4_;
      if (0.16666667 <= fVar178) break;
      auVar317 = vshufps_avx(_local_528,_local_528,0x50);
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = &DAT_3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar121,auVar317);
      fVar194 = auVar317._0_4_;
      auVar145._0_4_ = fVar290 * fVar194;
      fVar195 = auVar317._4_4_;
      auVar145._4_4_ = fVar299 * fVar195;
      fVar136 = auVar317._8_4_;
      auVar145._8_4_ = fVar290 * fVar136;
      fVar112 = auVar317._12_4_;
      auVar145._12_4_ = fVar299 * fVar112;
      auVar164._0_4_ = fVar219 * fVar194;
      auVar164._4_4_ = fVar241 * fVar195;
      auVar164._8_4_ = fVar219 * fVar136;
      auVar164._12_4_ = fVar241 * fVar112;
      auVar187._0_4_ = fVar258 * fVar194;
      auVar187._4_4_ = fVar267 * fVar195;
      auVar187._8_4_ = fVar258 * fVar136;
      auVar187._12_4_ = fVar267 * fVar112;
      auVar102._0_4_ = fVar268 * fVar194;
      auVar102._4_4_ = fVar278 * fVar195;
      auVar102._8_4_ = fVar268 * fVar136;
      auVar102._12_4_ = fVar278 * fVar112;
      auVar317 = vfmadd231ps_fma(auVar145,auVar20,local_3d8);
      auVar138 = vfmadd231ps_fma(auVar164,auVar20,local_3e8);
      auVar124 = vfmadd231ps_fma(auVar187,auVar20,local_3f8);
      auVar20 = vfmadd231ps_fma(auVar102,auVar20,local_408);
      auVar132._16_16_ = auVar317;
      auVar132._0_16_ = auVar317;
      auVar152._16_16_ = auVar138;
      auVar152._0_16_ = auVar138;
      auVar174._16_16_ = auVar124;
      auVar174._0_16_ = auVar124;
      auVar213._4_4_ = auVar213._0_4_;
      auVar213._8_4_ = auVar213._0_4_;
      auVar213._12_4_ = auVar213._0_4_;
      auVar213._20_4_ = local_458;
      auVar213._16_4_ = local_458;
      auVar213._24_4_ = local_458;
      auVar213._28_4_ = local_458;
      auVar87 = vsubps_avx(auVar152,auVar132);
      auVar138 = vfmadd213ps_fma(auVar87,auVar213,auVar132);
      auVar87 = vsubps_avx(auVar174,auVar152);
      auVar75 = vfmadd213ps_fma(auVar87,auVar213,auVar152);
      auVar317 = vsubps_avx(auVar20,auVar124);
      auVar153._16_16_ = auVar317;
      auVar153._0_16_ = auVar317;
      auVar317 = vfmadd213ps_fma(auVar153,auVar213,auVar174);
      auVar87 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar138));
      auVar20 = vfmadd213ps_fma(auVar87,auVar213,ZEXT1632(auVar138));
      auVar87 = vsubps_avx(ZEXT1632(auVar317),ZEXT1632(auVar75));
      auVar317 = vfmadd213ps_fma(auVar87,auVar213,ZEXT1632(auVar75));
      auVar87 = vsubps_avx(ZEXT1632(auVar317),ZEXT1632(auVar20));
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar87,auVar213);
      fVar133 = auVar87._4_4_ * 3.0;
      fVar111 = fVar178 * 0.33333334;
      auVar272._0_8_ =
           CONCAT44(auVar88._4_4_ + fVar111 * fVar133,auVar88._0_4_ + fVar111 * auVar87._0_4_ * 3.0)
      ;
      auVar272._8_4_ = auVar88._8_4_ + fVar111 * auVar87._8_4_ * 3.0;
      auVar272._12_4_ = auVar88._12_4_ + fVar111 * auVar87._12_4_ * 3.0;
      auVar20 = vshufpd_avx(auVar88,auVar88,3);
      auVar138 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_478 = auVar20;
      auVar22 = _local_478;
      auVar317 = vsubps_avx(auVar20,auVar88);
      auVar124 = vsubps_avx(auVar138,(undefined1  [16])0x0);
      auVar122._0_4_ = auVar317._0_4_ + auVar124._0_4_;
      auVar122._4_4_ = auVar317._4_4_ + auVar124._4_4_;
      auVar122._8_4_ = auVar317._8_4_ + auVar124._8_4_;
      auVar122._12_4_ = auVar317._12_4_ + auVar124._12_4_;
      auVar317 = vshufps_avx(auVar88,auVar88,0xb1);
      auVar124 = vshufps_avx(auVar272,auVar272,0xb1);
      auVar303._4_4_ = auVar122._0_4_;
      auVar303._0_4_ = auVar122._0_4_;
      auVar303._8_4_ = auVar122._0_4_;
      auVar303._12_4_ = auVar122._0_4_;
      auVar75 = vshufps_avx(auVar122,auVar122,0x55);
      fVar194 = auVar75._0_4_;
      auVar230._0_4_ = auVar317._0_4_ * fVar194;
      fVar195 = auVar75._4_4_;
      auVar230._4_4_ = auVar317._4_4_ * fVar195;
      fVar136 = auVar75._8_4_;
      auVar230._8_4_ = auVar317._8_4_ * fVar136;
      fVar112 = auVar75._12_4_;
      auVar230._12_4_ = auVar317._12_4_ * fVar112;
      auVar247._0_4_ = auVar124._0_4_ * fVar194;
      auVar247._4_4_ = auVar124._4_4_ * fVar195;
      auVar247._8_4_ = auVar124._8_4_ * fVar136;
      auVar247._12_4_ = auVar124._12_4_ * fVar112;
      auVar249 = vfmadd231ps_fma(auVar230,auVar303,auVar88);
      local_328._0_16_ = auVar272;
      auVar74 = vfmadd231ps_fma(auVar247,auVar303,auVar272);
      auVar124 = vshufps_avx(auVar249,auVar249,0xe8);
      auVar75 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar317 = vcmpps_avx(auVar124,auVar75,1);
      uVar62 = vextractps_avx(auVar317,0);
      auVar89 = auVar74;
      if ((uVar62 & 1) == 0) {
        auVar89 = auVar249;
      }
      auVar165._0_4_ = fVar111 * auVar87._16_4_ * 3.0;
      auVar165._4_4_ = fVar111 * fVar133;
      auVar165._8_4_ = fVar111 * auVar87._24_4_ * 3.0;
      auVar165._12_4_ = fVar111 * local_458;
      auVar114 = vsubps_avx((undefined1  [16])0x0,auVar165);
      auVar166 = vshufps_avx(auVar114,auVar114,0xb1);
      auVar95 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar325._0_4_ = auVar166._0_4_ * fVar194;
      auVar325._4_4_ = auVar166._4_4_ * fVar195;
      auVar325._8_4_ = auVar166._8_4_ * fVar136;
      auVar325._12_4_ = auVar166._12_4_ * fVar112;
      auVar123._0_4_ = auVar95._0_4_ * fVar194;
      auVar123._4_4_ = auVar95._4_4_ * fVar195;
      auVar123._8_4_ = auVar95._8_4_ * fVar136;
      auVar123._12_4_ = auVar95._12_4_ * fVar112;
      auVar115 = vfmadd231ps_fma(auVar325,auVar303,auVar114);
      auVar155 = vfmadd231ps_fma(auVar123,(undefined1  [16])0x0,auVar303);
      auVar95 = vshufps_avx(auVar115,auVar115,0xe8);
      auVar113 = vshufps_avx(auVar155,auVar155,0xe8);
      auVar166 = vcmpps_avx(auVar95,auVar113,1);
      uVar62 = vextractps_avx(auVar166,0);
      auVar179 = auVar155;
      if ((uVar62 & 1) == 0) {
        auVar179 = auVar115;
      }
      auVar89 = vmaxss_avx(auVar179,auVar89);
      auVar124 = vminps_avx(auVar124,auVar75);
      auVar75 = vminps_avx(auVar95,auVar113);
      auVar75 = vminps_avx(auVar124,auVar75);
      auVar317 = vshufps_avx(auVar317,auVar317,0x55);
      auVar317 = vblendps_avx(auVar317,auVar166,2);
      auVar166 = vpslld_avx(auVar317,0x1f);
      auVar317 = vshufpd_avx(auVar74,auVar74,1);
      auVar317 = vinsertps_avx(auVar317,auVar155,0x9c);
      auVar124 = vshufpd_avx(auVar249,auVar249,1);
      auVar124 = vinsertps_avx(auVar124,auVar115,0x9c);
      auVar317 = vblendvps_avx(auVar124,auVar317,auVar166);
      auVar124 = vmovshdup_avx(auVar317);
      auVar317 = vmaxss_avx(auVar124,auVar317);
      fVar136 = auVar75._0_4_;
      auVar124 = vmovshdup_avx(auVar75);
      fVar195 = auVar317._0_4_;
      fVar194 = auVar89._0_4_;
      _local_478 = auVar22;
      if ((0.0001 <= fVar136) || (fVar195 <= -0.0001)) {
        auVar249 = vcmpps_avx(auVar124,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar74 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar249 = vorps_avx(auVar74,auVar249);
        if ((-0.0001 < fVar194 & auVar249[0]) != 0) goto LAB_01789357;
        auVar249 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar317,5);
        auVar74 = vcmpps_avx(auVar124,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar249 = vorps_avx(auVar74,auVar249);
        if ((auVar249 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01789357;
LAB_01789d1e:
        bVar53 = true;
      }
      else {
LAB_01789357:
        auVar74 = vcmpps_avx(auVar75,_DAT_01feba10,1);
        auVar166 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar249 = vcmpss_avx(auVar89,ZEXT816(0) << 0x20,1);
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = &DAT_3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar248._8_4_ = 0xbf800000;
        auVar248._0_8_ = 0xbf800000bf800000;
        auVar248._12_4_ = 0xbf800000;
        auVar249 = vblendvps_avx(auVar188,auVar248,auVar249);
        auVar74 = vblendvps_avx(auVar188,auVar248,auVar74);
        fVar112 = auVar74._0_4_;
        fVar111 = auVar249._0_4_;
        auVar249 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar112 == fVar111) && (!NAN(fVar112) && !NAN(fVar111))) {
          auVar249 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar95 = ZEXT816(0) << 0x20;
        if ((fVar112 == fVar111) && (!NAN(fVar112) && !NAN(fVar111))) {
          auVar166 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar74 = vmovshdup_avx(auVar74);
        fVar133 = auVar74._0_4_;
        if ((fVar112 != fVar133) || (NAN(fVar112) || NAN(fVar133))) {
          fVar112 = auVar124._0_4_;
          if ((fVar112 != fVar136) || (NAN(fVar112) || NAN(fVar136))) {
            auVar125._0_4_ = (float)((uint)fVar136 ^ local_368);
            auVar125._4_4_ = auVar75._4_4_ ^ uStack_364;
            auVar125._8_4_ = auVar75._8_4_ ^ uStack_360;
            auVar125._12_4_ = auVar75._12_4_ ^ uStack_35c;
            auVar167._0_4_ = auVar125._0_4_ / (fVar112 - fVar136);
            auVar167._4_12_ = auVar125._4_12_;
            auVar124 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar167._0_4_)),auVar95,auVar167);
            auVar75 = auVar124;
          }
          else {
            auVar124 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar136 == 0.0) && (auVar124 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar136))) {
              auVar124 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar136 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar136))) {
              auVar75 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar249 = vminss_avx(auVar249,auVar124);
          auVar166 = vmaxss_avx(auVar75,auVar166);
        }
        auVar317 = vcmpss_avx(auVar317,auVar95,1);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = &DAT_3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar292._8_4_ = 0xbf800000;
        auVar292._0_8_ = 0xbf800000bf800000;
        auVar292._12_4_ = 0xbf800000;
        auVar317 = vblendvps_avx(auVar168,auVar292,auVar317);
        fVar136 = auVar317._0_4_;
        auVar317 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar111 != fVar136) || (NAN(fVar111) || NAN(fVar136))) {
          if ((fVar195 != fVar194) || (NAN(fVar195) || NAN(fVar194))) {
            auVar126._0_4_ = (float)((uint)fVar194 ^ local_368);
            auVar126._4_4_ = auVar89._4_4_ ^ uStack_364;
            auVar126._8_4_ = auVar89._8_4_ ^ uStack_360;
            auVar126._12_4_ = auVar89._12_4_ ^ uStack_35c;
            auVar169._0_4_ = auVar126._0_4_ / (fVar195 - fVar194);
            auVar169._4_12_ = auVar126._4_12_;
            auVar124 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar169._0_4_)),auVar95,auVar169);
            auVar75 = auVar124;
          }
          else {
            auVar124 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar194 == 0.0) && (auVar124 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar194))) {
              auVar124 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar194 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar194))) {
              auVar75 = auVar317;
            }
          }
          auVar249 = vminss_avx(auVar249,auVar124);
          auVar166 = vmaxss_avx(auVar75,auVar166);
        }
        if ((fVar133 != fVar136) || (NAN(fVar133) || NAN(fVar136))) {
          auVar249 = vminss_avx(auVar249,auVar317);
          auVar166 = vmaxss_avx(auVar317,auVar166);
        }
        auVar124 = vmaxss_avx(auVar95,auVar249);
        auVar75 = vminss_avx(auVar166,auVar317);
        bVar53 = true;
        if (auVar124._0_4_ <= auVar75._0_4_) {
          auVar124 = vmaxss_avx(auVar95,ZEXT416((uint)(auVar124._0_4_ + -0.1)));
          auVar317 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar317);
          auVar103._0_8_ = auVar88._0_8_;
          auVar103._8_8_ = auVar103._0_8_;
          auVar250._8_8_ = auVar272._0_8_;
          auVar250._0_8_ = auVar272._0_8_;
          auVar262._8_8_ = auVar114._0_8_;
          auVar262._0_8_ = auVar114._0_8_;
          auVar75 = vshufpd_avx(auVar272,auVar272,3);
          auVar249 = vshufpd_avx(auVar114,auVar114,3);
          auVar74 = vshufps_avx(auVar124,auVar317,0);
          auVar146._8_4_ = 0x3f800000;
          auVar146._0_8_ = &DAT_3f8000003f800000;
          auVar146._12_4_ = 0x3f800000;
          auVar88 = vsubps_avx(auVar146,auVar74);
          local_478._0_4_ = auVar20._0_4_;
          local_478._4_4_ = auVar20._4_4_;
          fStack_470 = auVar20._8_4_;
          fStack_46c = auVar20._12_4_;
          fVar194 = auVar74._0_4_;
          auVar147._0_4_ = fVar194 * (float)local_478._0_4_;
          fVar195 = auVar74._4_4_;
          auVar147._4_4_ = fVar195 * (float)local_478._4_4_;
          fVar136 = auVar74._8_4_;
          auVar147._8_4_ = fVar136 * fStack_470;
          fVar112 = auVar74._12_4_;
          auVar147._12_4_ = fVar112 * fStack_46c;
          auVar170._0_4_ = auVar75._0_4_ * fVar194;
          auVar170._4_4_ = auVar75._4_4_ * fVar195;
          auVar170._8_4_ = auVar75._8_4_ * fVar136;
          auVar170._12_4_ = auVar75._12_4_ * fVar112;
          auVar189._0_4_ = auVar249._0_4_ * fVar194;
          auVar189._4_4_ = auVar249._4_4_ * fVar195;
          auVar189._8_4_ = auVar249._8_4_ * fVar136;
          auVar189._12_4_ = auVar249._12_4_ * fVar112;
          local_4e8._0_4_ = auVar138._0_4_;
          local_4e8._4_4_ = auVar138._4_4_;
          uStack_4e0._0_4_ = auVar138._8_4_;
          uStack_4e0._4_4_ = auVar138._12_4_;
          auVar208._0_4_ = fVar194 * (float)local_4e8._0_4_;
          auVar208._4_4_ = fVar195 * (float)local_4e8._4_4_;
          auVar208._8_4_ = fVar136 * (float)uStack_4e0;
          auVar208._12_4_ = fVar112 * uStack_4e0._4_4_;
          auVar75 = vfmadd231ps_fma(auVar147,auVar88,auVar103);
          auVar249 = vfmadd231ps_fma(auVar170,auVar88,auVar250);
          auVar74 = vfmadd231ps_fma(auVar189,auVar88,auVar262);
          auVar88 = vfmadd231ps_fma(auVar208,auVar88,ZEXT816(0));
          auVar20 = vmovshdup_avx(_local_528);
          auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar124._0_4_)),_local_528,
                                    ZEXT416((uint)(1.0 - auVar124._0_4_)));
          auVar113 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar317._0_4_)),_local_528,
                                     ZEXT416((uint)(1.0 - auVar317._0_4_)));
          fVar194 = 1.0 / fVar178;
          auVar317 = vsubps_avx(auVar249,auVar75);
          auVar231._0_4_ = auVar317._0_4_ * 3.0;
          auVar231._4_4_ = auVar317._4_4_ * 3.0;
          auVar231._8_4_ = auVar317._8_4_ * 3.0;
          auVar231._12_4_ = auVar317._12_4_ * 3.0;
          auVar317 = vsubps_avx(auVar74,auVar249);
          auVar251._0_4_ = auVar317._0_4_ * 3.0;
          auVar251._4_4_ = auVar317._4_4_ * 3.0;
          auVar251._8_4_ = auVar317._8_4_ * 3.0;
          auVar251._12_4_ = auVar317._12_4_ * 3.0;
          auVar317 = vsubps_avx(auVar88,auVar74);
          auVar263._0_4_ = auVar317._0_4_ * 3.0;
          auVar263._4_4_ = auVar317._4_4_ * 3.0;
          auVar263._8_4_ = auVar317._8_4_ * 3.0;
          auVar263._12_4_ = auVar317._12_4_ * 3.0;
          auVar20 = vminps_avx(auVar251,auVar263);
          auVar317 = vmaxps_avx(auVar251,auVar263);
          auVar20 = vminps_avx(auVar231,auVar20);
          auVar317 = vmaxps_avx(auVar231,auVar317);
          auVar138 = vshufpd_avx(auVar20,auVar20,3);
          auVar124 = vshufpd_avx(auVar317,auVar317,3);
          auVar20 = vminps_avx(auVar20,auVar138);
          auVar317 = vmaxps_avx(auVar317,auVar124);
          auVar252._0_4_ = auVar20._0_4_ * fVar194;
          auVar252._4_4_ = auVar20._4_4_ * fVar194;
          auVar252._8_4_ = auVar20._8_4_ * fVar194;
          auVar252._12_4_ = auVar20._12_4_ * fVar194;
          auVar232._0_4_ = fVar194 * auVar317._0_4_;
          auVar232._4_4_ = fVar194 * auVar317._4_4_;
          auVar232._8_4_ = fVar194 * auVar317._8_4_;
          auVar232._12_4_ = fVar194 * auVar317._12_4_;
          fVar194 = 1.0 / (auVar113._0_4_ - auVar95._0_4_);
          auVar317 = vshufpd_avx(auVar75,auVar75,3);
          auVar20 = vshufpd_avx(auVar249,auVar249,3);
          auVar138 = vshufpd_avx(auVar74,auVar74,3);
          auVar124 = vshufpd_avx(auVar88,auVar88,3);
          auVar317 = vsubps_avx(auVar317,auVar75);
          auVar75 = vsubps_avx(auVar20,auVar249);
          auVar249 = vsubps_avx(auVar138,auVar74);
          auVar124 = vsubps_avx(auVar124,auVar88);
          auVar20 = vminps_avx(auVar317,auVar75);
          auVar317 = vmaxps_avx(auVar317,auVar75);
          auVar138 = vminps_avx(auVar249,auVar124);
          auVar138 = vminps_avx(auVar20,auVar138);
          auVar20 = vmaxps_avx(auVar249,auVar124);
          auVar317 = vmaxps_avx(auVar317,auVar20);
          auVar283._0_4_ = fVar194 * auVar138._0_4_;
          auVar283._4_4_ = fVar194 * auVar138._4_4_;
          auVar283._8_4_ = fVar194 * auVar138._8_4_;
          auVar283._12_4_ = fVar194 * auVar138._12_4_;
          auVar273._0_4_ = fVar194 * auVar317._0_4_;
          auVar273._4_4_ = fVar194 * auVar317._4_4_;
          auVar273._8_4_ = fVar194 * auVar317._8_4_;
          auVar273._12_4_ = fVar194 * auVar317._12_4_;
          auVar124 = vinsertps_avx(auVar21,auVar95,0x10);
          auVar75 = vinsertps_avx(auVar15,auVar113,0x10);
          auVar85._0_4_ = (auVar124._0_4_ + auVar75._0_4_) * 0.5;
          auVar85._4_4_ = (auVar124._4_4_ + auVar75._4_4_) * 0.5;
          auVar85._8_4_ = (auVar124._8_4_ + auVar75._8_4_) * 0.5;
          auVar85._12_4_ = (auVar124._12_4_ + auVar75._12_4_) * 0.5;
          auVar148._4_4_ = auVar85._0_4_;
          auVar148._0_4_ = auVar85._0_4_;
          auVar148._8_4_ = auVar85._0_4_;
          auVar148._12_4_ = auVar85._0_4_;
          auVar317 = vfmadd213ps_fma(local_348,auVar148,auVar16);
          auVar20 = vfmadd213ps_fma(local_358,auVar148,auVar17);
          auVar138 = vfmadd213ps_fma(local_208,auVar148,auVar183);
          auVar15 = vsubps_avx(auVar20,auVar317);
          auVar317 = vfmadd213ps_fma(auVar15,auVar148,auVar317);
          auVar15 = vsubps_avx(auVar138,auVar20);
          auVar15 = vfmadd213ps_fma(auVar15,auVar148,auVar20);
          auVar15 = vsubps_avx(auVar15,auVar317);
          auVar317 = vfmadd231ps_fma(auVar317,auVar15,auVar148);
          auVar149._0_8_ = CONCAT44(auVar15._4_4_ * 3.0,auVar15._0_4_ * 3.0);
          auVar149._8_4_ = auVar15._8_4_ * 3.0;
          auVar149._12_4_ = auVar15._12_4_ * 3.0;
          auVar264._8_8_ = auVar317._0_8_;
          auVar264._0_8_ = auVar317._0_8_;
          auVar15 = vshufpd_avx(auVar317,auVar317,3);
          auVar317 = vshufps_avx(auVar85,auVar85,0x55);
          auVar249 = vsubps_avx(auVar15,auVar264);
          auVar88 = vfmadd231ps_fma(auVar264,auVar317,auVar249);
          auVar304._8_8_ = auVar149._0_8_;
          auVar304._0_8_ = auVar149._0_8_;
          auVar15 = vshufpd_avx(auVar149,auVar149,3);
          auVar15 = vsubps_avx(auVar15,auVar304);
          auVar74 = vfmadd213ps_fma(auVar15,auVar317,auVar304);
          auVar317 = vmovshdup_avx(auVar74);
          auVar305._0_8_ = auVar317._0_8_ ^ 0x8000000080000000;
          auVar305._8_4_ = auVar317._8_4_ ^ 0x80000000;
          auVar305._12_4_ = auVar317._12_4_ ^ 0x80000000;
          auVar20 = vmovshdup_avx(auVar249);
          auVar15 = vunpcklps_avx(auVar20,auVar305);
          auVar138 = vshufps_avx(auVar15,auVar305,4);
          auVar326._0_8_ = auVar249._0_8_ ^ 0x8000000080000000;
          auVar326._8_4_ = auVar249._8_4_ ^ 0x80000000;
          auVar326._12_4_ = auVar249._12_4_ ^ 0x80000000;
          auVar15 = vmovlhps_avx(auVar326,auVar74);
          auVar15 = vshufps_avx(auVar15,auVar74,8);
          auVar317 = vfmsub231ss_fma(ZEXT416((uint)(auVar317._0_4_ * auVar249._0_4_)),auVar20,
                                     auVar74);
          auVar171._0_4_ = auVar317._0_4_;
          auVar171._4_4_ = auVar171._0_4_;
          auVar171._8_4_ = auVar171._0_4_;
          auVar171._12_4_ = auVar171._0_4_;
          auVar317 = vdivps_avx(auVar138,auVar171);
          auVar20 = vdivps_avx(auVar15,auVar171);
          fVar136 = auVar88._0_4_;
          fVar194 = auVar317._0_4_;
          auVar15 = vshufps_avx(auVar88,auVar88,0x55);
          fVar195 = auVar20._0_4_;
          local_4e8._4_4_ = fVar136 * auVar317._4_4_ + auVar15._4_4_ * auVar20._4_4_;
          local_4e8._0_4_ = fVar136 * fVar194 + auVar15._0_4_ * fVar195;
          uStack_4e0._0_4_ = fVar136 * auVar317._8_4_ + auVar15._8_4_ * auVar20._8_4_;
          uStack_4e0._4_4_ = fVar136 * auVar317._12_4_ + auVar15._12_4_ * auVar20._12_4_;
          auVar249 = vmovshdup_avx(auVar317);
          auVar15 = vinsertps_avx(auVar252,auVar283,0x1c);
          auVar318._0_4_ = auVar249._0_4_ * auVar15._0_4_;
          auVar318._4_4_ = auVar249._4_4_ * auVar15._4_4_;
          auVar318._8_4_ = auVar249._8_4_ * auVar15._8_4_;
          auVar318._12_4_ = auVar249._12_4_ * auVar15._12_4_;
          auVar138 = vinsertps_avx(auVar232,auVar273,0x1c);
          auVar293._0_4_ = auVar249._0_4_ * auVar138._0_4_;
          auVar293._4_4_ = auVar249._4_4_ * auVar138._4_4_;
          auVar293._8_4_ = auVar249._8_4_ * auVar138._8_4_;
          auVar293._12_4_ = auVar249._12_4_ * auVar138._12_4_;
          auVar89 = vminps_avx(auVar318,auVar293);
          auVar88 = vmaxps_avx(auVar293,auVar318);
          auVar249 = vinsertps_avx(auVar283,auVar252,0x4c);
          auVar166 = vmovshdup_avx(auVar20);
          auVar74 = vinsertps_avx(auVar273,auVar232,0x4c);
          auVar274._0_4_ = auVar166._0_4_ * auVar249._0_4_;
          auVar274._4_4_ = auVar166._4_4_ * auVar249._4_4_;
          auVar274._8_4_ = auVar166._8_4_ * auVar249._8_4_;
          auVar274._12_4_ = auVar166._12_4_ * auVar249._12_4_;
          auVar284._0_4_ = auVar166._0_4_ * auVar74._0_4_;
          auVar284._4_4_ = auVar166._4_4_ * auVar74._4_4_;
          auVar284._8_4_ = auVar166._8_4_ * auVar74._8_4_;
          auVar284._12_4_ = auVar166._12_4_ * auVar74._12_4_;
          auVar166 = vminps_avx(auVar274,auVar284);
          auVar104._0_4_ = auVar166._0_4_ + auVar89._0_4_;
          auVar104._4_4_ = auVar166._4_4_ + auVar89._4_4_;
          auVar104._8_4_ = auVar166._8_4_ + auVar89._8_4_;
          auVar104._12_4_ = auVar166._12_4_ + auVar89._12_4_;
          auVar89 = vmaxps_avx(auVar284,auVar274);
          auVar275._0_4_ = auVar88._0_4_ + auVar89._0_4_;
          auVar275._4_4_ = auVar88._4_4_ + auVar89._4_4_;
          auVar275._8_4_ = auVar88._8_4_ + auVar89._8_4_;
          auVar275._12_4_ = auVar88._12_4_ + auVar89._12_4_;
          auVar285._8_8_ = 0x3f80000000000000;
          auVar285._0_8_ = 0x3f80000000000000;
          auVar88 = vsubps_avx(auVar285,auVar275);
          auVar89 = vsubps_avx(auVar285,auVar104);
          auVar166 = vsubps_avx(auVar124,auVar85);
          auVar306._0_4_ = fVar194 * auVar15._0_4_;
          auVar306._4_4_ = fVar194 * auVar15._4_4_;
          auVar306._8_4_ = fVar194 * auVar15._8_4_;
          auVar306._12_4_ = fVar194 * auVar15._12_4_;
          auVar294._0_4_ = fVar194 * auVar138._0_4_;
          auVar294._4_4_ = fVar194 * auVar138._4_4_;
          auVar294._8_4_ = fVar194 * auVar138._8_4_;
          auVar294._12_4_ = fVar194 * auVar138._12_4_;
          auVar138 = vminps_avx(auVar306,auVar294);
          auVar15 = vmaxps_avx(auVar294,auVar306);
          auVar253._0_4_ = fVar195 * auVar249._0_4_;
          auVar253._4_4_ = fVar195 * auVar249._4_4_;
          auVar253._8_4_ = fVar195 * auVar249._8_4_;
          auVar253._12_4_ = fVar195 * auVar249._12_4_;
          auVar233._0_4_ = fVar195 * auVar74._0_4_;
          auVar233._4_4_ = fVar195 * auVar74._4_4_;
          auVar233._8_4_ = fVar195 * auVar74._8_4_;
          auVar233._12_4_ = fVar195 * auVar74._12_4_;
          auVar249 = vminps_avx(auVar253,auVar233);
          auVar307._0_4_ = auVar138._0_4_ + auVar249._0_4_;
          auVar307._4_4_ = auVar138._4_4_ + auVar249._4_4_;
          auVar307._8_4_ = auVar138._8_4_ + auVar249._8_4_;
          auVar307._12_4_ = auVar138._12_4_ + auVar249._12_4_;
          auVar249 = vsubps_avx(auVar75,auVar85);
          auVar138 = vmaxps_avx(auVar233,auVar253);
          fVar136 = auVar166._0_4_;
          auVar254._0_4_ = fVar136 * auVar88._0_4_;
          fVar112 = auVar166._4_4_;
          auVar254._4_4_ = fVar112 * auVar88._4_4_;
          fVar111 = auVar166._8_4_;
          auVar254._8_4_ = fVar111 * auVar88._8_4_;
          fVar133 = auVar166._12_4_;
          auVar254._12_4_ = fVar133 * auVar88._12_4_;
          auVar234._0_4_ = auVar15._0_4_ + auVar138._0_4_;
          auVar234._4_4_ = auVar15._4_4_ + auVar138._4_4_;
          auVar234._8_4_ = auVar15._8_4_ + auVar138._8_4_;
          auVar234._12_4_ = auVar15._12_4_ + auVar138._12_4_;
          auVar295._8_8_ = 0x3f800000;
          auVar295._0_8_ = 0x3f800000;
          auVar15 = vsubps_avx(auVar295,auVar234);
          auVar138 = vsubps_avx(auVar295,auVar307);
          auVar308._0_4_ = fVar136 * auVar89._0_4_;
          auVar308._4_4_ = fVar112 * auVar89._4_4_;
          auVar308._8_4_ = fVar111 * auVar89._8_4_;
          auVar308._12_4_ = fVar133 * auVar89._12_4_;
          fVar134 = auVar249._0_4_;
          auVar276._0_4_ = fVar134 * auVar88._0_4_;
          fVar135 = auVar249._4_4_;
          auVar276._4_4_ = fVar135 * auVar88._4_4_;
          fVar154 = auVar249._8_4_;
          auVar276._8_4_ = fVar154 * auVar88._8_4_;
          fVar175 = auVar249._12_4_;
          auVar276._12_4_ = fVar175 * auVar88._12_4_;
          auVar105._0_4_ = fVar134 * auVar89._0_4_;
          auVar105._4_4_ = fVar135 * auVar89._4_4_;
          auVar105._8_4_ = fVar154 * auVar89._8_4_;
          auVar105._12_4_ = fVar175 * auVar89._12_4_;
          auVar327._0_4_ = fVar136 * auVar15._0_4_;
          auVar327._4_4_ = fVar112 * auVar15._4_4_;
          auVar327._8_4_ = fVar111 * auVar15._8_4_;
          auVar327._12_4_ = fVar133 * auVar15._12_4_;
          auVar286._0_4_ = fVar136 * auVar138._0_4_;
          auVar286._4_4_ = fVar112 * auVar138._4_4_;
          auVar286._8_4_ = fVar111 * auVar138._8_4_;
          auVar286._12_4_ = fVar133 * auVar138._12_4_;
          auVar235._0_4_ = fVar134 * auVar15._0_4_;
          auVar235._4_4_ = fVar135 * auVar15._4_4_;
          auVar235._8_4_ = fVar154 * auVar15._8_4_;
          auVar235._12_4_ = fVar175 * auVar15._12_4_;
          auVar296._0_4_ = fVar134 * auVar138._0_4_;
          auVar296._4_4_ = fVar135 * auVar138._4_4_;
          auVar296._8_4_ = fVar154 * auVar138._8_4_;
          auVar296._12_4_ = fVar175 * auVar138._12_4_;
          auVar15 = vminps_avx(auVar327,auVar286);
          auVar138 = vminps_avx(auVar235,auVar296);
          auVar15 = vminps_avx(auVar15,auVar138);
          auVar138 = vmaxps_avx(auVar286,auVar327);
          auVar249 = vminps_avx(auVar254,auVar308);
          auVar74 = vminps_avx(auVar276,auVar105);
          auVar249 = vminps_avx(auVar249,auVar74);
          auVar15 = vhaddps_avx(auVar15,auVar249);
          auVar249 = vmaxps_avx(auVar296,auVar235);
          auVar138 = vmaxps_avx(auVar249,auVar138);
          auVar249 = vmaxps_avx(auVar308,auVar254);
          auVar74 = vmaxps_avx(auVar105,auVar276);
          auVar249 = vmaxps_avx(auVar74,auVar249);
          auVar138 = vhaddps_avx(auVar138,auVar249);
          auVar249 = vshufps_avx(auVar85,auVar85,0x54);
          auVar249 = vsubps_avx(auVar249,_local_4e8);
          auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
          auVar138 = vshufps_avx(auVar138,auVar138,0xe8);
          auVar255._0_4_ = auVar249._0_4_ + auVar15._0_4_;
          auVar255._4_4_ = auVar249._4_4_ + auVar15._4_4_;
          auVar255._8_4_ = auVar249._8_4_ + auVar15._8_4_;
          auVar255._12_4_ = auVar249._12_4_ + auVar15._12_4_;
          auVar236._0_4_ = auVar249._0_4_ + auVar138._0_4_;
          auVar236._4_4_ = auVar249._4_4_ + auVar138._4_4_;
          auVar236._8_4_ = auVar249._8_4_ + auVar138._8_4_;
          auVar236._12_4_ = auVar249._12_4_ + auVar138._12_4_;
          auVar15 = vmaxps_avx(auVar124,auVar255);
          auVar138 = vminps_avx(auVar236,auVar75);
          auVar15 = vcmpps_avx(auVar138,auVar15,1);
          auVar15 = vshufps_avx(auVar15,auVar15,0x50);
          _local_528 = vinsertps_avx(auVar95,ZEXT416((uint)auVar113._0_4_),0x10);
          if ((auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar15[0xf] < '\0') goto LAB_01789d1e;
          bVar68 = 0;
          if ((auVar213._0_4_ < auVar255._0_4_) && (bVar68 = 0, auVar236._0_4_ < auVar75._0_4_)) {
            auVar138 = vmovshdup_avx(auVar255);
            auVar15 = vcmpps_avx(auVar236,auVar75,1);
            bVar68 = auVar15[4] & auVar95._0_4_ < auVar138._0_4_;
          }
          if (((3 < (uint)uVar65 || fVar178 < 0.001) | bVar68) == 1) {
            lVar67 = 200;
            do {
              fVar111 = auVar249._0_4_;
              fVar112 = 1.0 - fVar111;
              fVar178 = fVar112 * fVar112 * fVar112;
              fVar136 = fVar111 * 3.0 * fVar112 * fVar112;
              fVar112 = fVar112 * fVar111 * fVar111 * 3.0;
              auVar190._4_4_ = fVar178;
              auVar190._0_4_ = fVar178;
              auVar190._8_4_ = fVar178;
              auVar190._12_4_ = fVar178;
              auVar127._4_4_ = fVar136;
              auVar127._0_4_ = fVar136;
              auVar127._8_4_ = fVar136;
              auVar127._12_4_ = fVar136;
              auVar106._4_4_ = fVar112;
              auVar106._0_4_ = fVar112;
              auVar106._8_4_ = fVar112;
              auVar106._12_4_ = fVar112;
              fVar111 = fVar111 * fVar111 * fVar111;
              auVar209._0_4_ = (float)local_2c8._0_4_ * fVar111;
              auVar209._4_4_ = (float)local_2c8._4_4_ * fVar111;
              auVar209._8_4_ = fStack_2c0 * fVar111;
              auVar209._12_4_ = fStack_2bc * fVar111;
              auVar15 = vfmadd231ps_fma(auVar209,auVar183,auVar106);
              auVar15 = vfmadd231ps_fma(auVar15,auVar17,auVar127);
              auVar15 = vfmadd231ps_fma(auVar15,auVar16,auVar190);
              auVar107._8_8_ = auVar15._0_8_;
              auVar107._0_8_ = auVar15._0_8_;
              auVar15 = vshufpd_avx(auVar15,auVar15,3);
              auVar138 = vshufps_avx(auVar249,auVar249,0x55);
              auVar15 = vsubps_avx(auVar15,auVar107);
              auVar138 = vfmadd213ps_fma(auVar15,auVar138,auVar107);
              fVar178 = auVar138._0_4_;
              auVar15 = vshufps_avx(auVar138,auVar138,0x55);
              auVar108._0_4_ = fVar194 * fVar178 + fVar195 * auVar15._0_4_;
              auVar108._4_4_ = auVar317._4_4_ * fVar178 + auVar20._4_4_ * auVar15._4_4_;
              auVar108._8_4_ = auVar317._8_4_ * fVar178 + auVar20._8_4_ * auVar15._8_4_;
              auVar108._12_4_ = auVar317._12_4_ * fVar178 + auVar20._12_4_ * auVar15._12_4_;
              auVar249 = vsubps_avx(auVar249,auVar108);
              auVar15 = vandps_avx(local_338,auVar138);
              auVar138 = vshufps_avx(auVar15,auVar15,0xf5);
              auVar15 = vmaxss_avx(auVar138,auVar15);
              if (auVar15._0_4_ < (float)local_218._0_4_) {
                fVar178 = auVar249._0_4_;
                if ((0.0 <= fVar178) && (fVar178 <= 1.0)) {
                  auVar15 = vmovshdup_avx(auVar249);
                  fVar194 = auVar15._0_4_;
                  if ((0.0 <= fVar194) && (fVar194 <= 1.0)) {
                    auVar15 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar88 = vinsertps_avx(auVar15,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                  [2]),0x28);
                    aVar5 = (ray->super_RayK<1>).org.field_0;
                    auVar15 = vsubps_avx(local_378,(undefined1  [16])aVar5);
                    auVar15 = vdpps_avx(auVar15,auVar88,0x7f);
                    auVar317 = vsubps_avx(local_388,(undefined1  [16])aVar5);
                    auVar317 = vdpps_avx(auVar317,auVar88,0x7f);
                    auVar20 = vsubps_avx(local_398,(undefined1  [16])aVar5);
                    auVar20 = vdpps_avx(auVar20,auVar88,0x7f);
                    auVar138 = vsubps_avx(local_3a8,(undefined1  [16])aVar5);
                    auVar138 = vdpps_avx(auVar138,auVar88,0x7f);
                    auVar124 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
                    auVar124 = vdpps_avx(auVar124,auVar88,0x7f);
                    auVar75 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
                    auVar75 = vdpps_avx(auVar75,auVar88,0x7f);
                    auVar74 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
                    auVar74 = vdpps_avx(auVar74,auVar88,0x7f);
                    auVar89 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
                    auVar88 = vdpps_avx(auVar89,auVar88,0x7f);
                    fVar195 = 1.0 - fVar194;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar124._0_4_ * fVar194)),
                                              ZEXT416((uint)fVar195),auVar15);
                    auVar317 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar194)),
                                               ZEXT416((uint)fVar195),auVar317);
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar194)),
                                              ZEXT416((uint)fVar195),auVar20);
                    auVar138 = vfmadd231ss_fma(ZEXT416((uint)(fVar194 * auVar88._0_4_)),
                                               ZEXT416((uint)fVar195),auVar138);
                    fVar112 = 1.0 - fVar178;
                    fVar194 = fVar112 * fVar178 * fVar178 * 3.0;
                    fVar133 = fVar178 * fVar178 * fVar178;
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar138._0_4_ * fVar133)),
                                              ZEXT416((uint)fVar194),auVar20);
                    fVar195 = fVar178 * 3.0 * fVar112 * fVar112;
                    auVar317 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar195),auVar317);
                    fVar136 = fVar112 * fVar112 * fVar112;
                    auVar15 = vfmadd231ss_fma(auVar317,ZEXT416((uint)fVar136),auVar15);
                    fVar111 = auVar15._0_4_;
                    if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar111) &&
                        (fVar134 = (ray->super_RayK<1>).tfar, fVar111 <= fVar134)) &&
                       (pGVar8 = (context->scene->geometries).items[uVar64].ptr,
                       (pGVar8->mask & (ray->super_RayK<1>).mask) != 0)) {
                      auVar15 = vshufps_avx(auVar249,auVar249,0x55);
                      auVar256._8_4_ = 0x3f800000;
                      auVar256._0_8_ = &DAT_3f8000003f800000;
                      auVar256._12_4_ = 0x3f800000;
                      auVar317 = vsubps_avx(auVar256,auVar15);
                      fVar135 = auVar15._0_4_;
                      auVar265._0_4_ = fVar135 * (float)local_3b8._0_4_;
                      fVar154 = auVar15._4_4_;
                      auVar265._4_4_ = fVar154 * (float)local_3b8._4_4_;
                      fVar175 = auVar15._8_4_;
                      auVar265._8_4_ = fVar175 * fStack_3b0;
                      fVar176 = auVar15._12_4_;
                      auVar265._12_4_ = fVar176 * fStack_3ac;
                      auVar277._0_4_ = fVar135 * (float)local_3c8._0_4_;
                      auVar277._4_4_ = fVar154 * (float)local_3c8._4_4_;
                      auVar277._8_4_ = fVar175 * fStack_3c0;
                      auVar277._12_4_ = fVar176 * fStack_3bc;
                      auVar287._0_4_ = fVar135 * (float)local_418._0_4_;
                      auVar287._4_4_ = fVar154 * (float)local_418._4_4_;
                      auVar287._8_4_ = fVar175 * fStack_410;
                      auVar287._12_4_ = fVar176 * fStack_40c;
                      auVar237._0_4_ = fVar135 * (float)local_428._0_4_;
                      auVar237._4_4_ = fVar154 * (float)local_428._4_4_;
                      auVar237._8_4_ = fVar175 * fStack_420;
                      auVar237._12_4_ = fVar176 * fStack_41c;
                      auVar15 = vfmadd231ps_fma(auVar265,auVar317,local_378);
                      auVar20 = vfmadd231ps_fma(auVar277,auVar317,local_388);
                      auVar138 = vfmadd231ps_fma(auVar287,auVar317,local_398);
                      auVar124 = vfmadd231ps_fma(auVar237,auVar317,local_3a8);
                      auVar15 = vsubps_avx(auVar20,auVar15);
                      auVar317 = vsubps_avx(auVar138,auVar20);
                      auVar20 = vsubps_avx(auVar124,auVar138);
                      auVar288._0_4_ = fVar178 * auVar317._0_4_;
                      auVar288._4_4_ = fVar178 * auVar317._4_4_;
                      auVar288._8_4_ = fVar178 * auVar317._8_4_;
                      auVar288._12_4_ = fVar178 * auVar317._12_4_;
                      auVar210._4_4_ = fVar112;
                      auVar210._0_4_ = fVar112;
                      auVar210._8_4_ = fVar112;
                      auVar210._12_4_ = fVar112;
                      auVar15 = vfmadd231ps_fma(auVar288,auVar210,auVar15);
                      auVar238._0_4_ = fVar178 * auVar20._0_4_;
                      auVar238._4_4_ = fVar178 * auVar20._4_4_;
                      auVar238._8_4_ = fVar178 * auVar20._8_4_;
                      auVar238._12_4_ = fVar178 * auVar20._12_4_;
                      auVar317 = vfmadd231ps_fma(auVar238,auVar210,auVar317);
                      auVar239._0_4_ = fVar178 * auVar317._0_4_;
                      auVar239._4_4_ = fVar178 * auVar317._4_4_;
                      auVar239._8_4_ = fVar178 * auVar317._8_4_;
                      auVar239._12_4_ = fVar178 * auVar317._12_4_;
                      auVar317 = vfmadd231ps_fma(auVar239,auVar210,auVar15);
                      auVar191._0_4_ = fVar133 * (float)local_268._0_4_;
                      auVar191._4_4_ = fVar133 * (float)local_268._4_4_;
                      auVar191._8_4_ = fVar133 * fStack_260;
                      auVar191._12_4_ = fVar133 * fStack_25c;
                      auVar128._4_4_ = fVar194;
                      auVar128._0_4_ = fVar194;
                      auVar128._8_4_ = fVar194;
                      auVar128._12_4_ = fVar194;
                      auVar15 = vfmadd132ps_fma(auVar128,auVar191,local_258);
                      auVar172._4_4_ = fVar195;
                      auVar172._0_4_ = fVar195;
                      auVar172._8_4_ = fVar195;
                      auVar172._12_4_ = fVar195;
                      auVar15 = vfmadd132ps_fma(auVar172,auVar15,local_248);
                      auVar192._0_4_ = auVar317._0_4_ * 3.0;
                      auVar192._4_4_ = auVar317._4_4_ * 3.0;
                      auVar192._8_4_ = auVar317._8_4_ * 3.0;
                      auVar192._12_4_ = auVar317._12_4_ * 3.0;
                      auVar150._4_4_ = fVar136;
                      auVar150._0_4_ = fVar136;
                      auVar150._8_4_ = fVar136;
                      auVar150._12_4_ = fVar136;
                      auVar317 = vfmadd132ps_fma(auVar150,auVar15,local_238);
                      auVar15 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar129._0_4_ = auVar317._0_4_ * auVar15._0_4_;
                      auVar129._4_4_ = auVar317._4_4_ * auVar15._4_4_;
                      auVar129._8_4_ = auVar317._8_4_ * auVar15._8_4_;
                      auVar129._12_4_ = auVar317._12_4_ * auVar15._12_4_;
                      auVar15 = vshufps_avx(auVar317,auVar317,0xc9);
                      auVar15 = vfmsub231ps_fma(auVar129,auVar192,auVar15);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar111;
                        auVar317 = vshufps_avx(auVar15,auVar15,0xe9);
                        uVar196 = vmovlps_avx(auVar317);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar196;
                        (ray->Ng).field_0.field_0.z = auVar15._0_4_;
                        uVar196 = vmovlps_avx(auVar249);
                        ray->u = (float)(int)uVar196;
                        ray->v = (float)(int)((ulong)uVar196 >> 0x20);
                        ray->primID = (uint)local_430;
                        ray->geomID = uVar64;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar317 = vshufps_avx(auVar15,auVar15,0xe9);
                        local_2a8 = vmovlps_avx(auVar317);
                        local_2a0 = auVar15._0_4_;
                        local_29c = vmovlps_avx(auVar249);
                        local_294 = (uint)local_430;
                        local_290 = uVar64;
                        local_28c = context->user->instID[0];
                        local_288 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar111;
                        local_47c = -1;
                        local_2f8.valid = &local_47c;
                        local_2f8.geometryUserPtr = pGVar8->userPtr;
                        local_2f8.context = context->user;
                        local_2f8.ray = (RTCRayN *)ray;
                        local_2f8.hit = (RTCHitN *)&local_2a8;
                        local_2f8.N = 1;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01789e78:
                          p_Var14 = context->args->filter;
                          if (p_Var14 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var14)(&local_2f8);
                            }
                            if (*local_2f8.valid == 0) goto LAB_01789f41;
                          }
                          (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).components[0] =
                               *(float *)local_2f8.hit;
                          (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_2f8.hit + 4);
                          (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_2f8.hit + 8);
                          *(float *)((long)local_2f8.ray + 0x3c) = *(float *)(local_2f8.hit + 0xc);
                          *(float *)((long)local_2f8.ray + 0x40) = *(float *)(local_2f8.hit + 0x10);
                          *(float *)((long)local_2f8.ray + 0x44) = *(float *)(local_2f8.hit + 0x14);
                          *(float *)((long)local_2f8.ray + 0x48) = *(float *)(local_2f8.hit + 0x18);
                          *(float *)((long)local_2f8.ray + 0x4c) = *(float *)(local_2f8.hit + 0x1c);
                          *(float *)((long)local_2f8.ray + 0x50) = *(float *)(local_2f8.hit + 0x20);
                        }
                        else {
                          _fStack_470 = auVar22._8_24_;
                          local_478 = auVar72;
                          (*pGVar8->intersectionFilterN)(&local_2f8);
                          auVar72 = local_478;
                          if (*local_2f8.valid != 0) goto LAB_01789e78;
LAB_01789f41:
                          (ray->super_RayK<1>).tfar = fVar134;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    auVar321 = ZEXT464(0x3f800000);
    local_228 = vinsertps_avx(auVar21,ZEXT416((uint)local_458),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }